

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

void polyscope::view::processRotate(vec2 startP,vec2 endP)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int i;
  long lVar9;
  int j;
  int iVar10;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *paVar11;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *paVar12;
  undefined1 auVar14 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 in_ZmmResult [64];
  undefined1 auVar35 [48];
  undefined1 auVar30 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 aVar36;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar70;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 in_register_00001208 [56];
  undefined1 auVar71 [56];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  double dVar42;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 extraout_var_00 [60];
  undefined1 auVar69 [64];
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 aVar72;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 in_register_00001248 [56];
  float fVar82;
  ulong uVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar91;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar97;
  float fVar109;
  float fVar110;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar111;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar162;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar183;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar181;
  float fVar182;
  undefined1 in_ZMM9 [64];
  float fVar184;
  float fVar195;
  float fVar196;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar197;
  undefined1 auVar194 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar215;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 in_ZMM22 [64];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 in_ZMM23 [64];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  vec3 vVar272;
  float a_2;
  vec3 frameRightDir;
  float a;
  float a_1;
  vec3 frameUpDir;
  vec3 frameLookDir;
  mat4x4 R;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  undefined1 local_1e8 [16];
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_1a4;
  float local_1a0;
  float local_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [64];
  float local_144;
  float local_140;
  float local_13c;
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  undefined1 local_128 [16];
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_114;
  float local_110;
  float local_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  vec3 local_ac;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 local_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint local_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  float local_80;
  float local_7c;
  uint local_78;
  uint uStack_74;
  undefined8 local_70;
  float local_68;
  float fStack_64;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  undefined1 auVar31 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  
  auVar22 = in_ZMM23._0_16_;
  auVar17 = in_ZMM22._0_16_;
  auVar35 = in_ZmmResult._16_48_;
  auVar18 = in_ZMM9._0_16_;
  auVar33._8_56_ = in_register_00001248;
  auVar33._0_8_ = endP;
  auVar32._8_56_ = in_register_00001208;
  auVar32._0_8_ = startP;
  auVar20 = vmovshdup_avx(auVar32._0_16_);
  auVar14 = vmovshdup_avx(auVar33._0_16_);
  aVar36 = startP.field_0;
  aVar72 = endP.field_0;
  fVar41 = auVar14._0_4_;
  if ((aVar36.x == aVar72.x) && (!NAN(aVar36.x) && !NAN(aVar72.x))) {
    if ((auVar20._0_4_ == fVar41) && (!NAN(auVar20._0_4_) && !NAN(fVar41))) {
      return;
    }
  }
  local_188._0_16_ = auVar20;
  getCameraFrame(&local_ac,(vec3 *)&local_114,(vec3 *)&local_1a4);
  switch(style) {
  case 0:
    dVar42 = ((double)(aVar72.x - aVar36.x) + (double)(aVar72.x - aVar36.x)) * moveScale;
    dVar2 = ((double)(fVar41 - (float)local_188._0_4_) + (double)(fVar41 - (float)local_188._0_4_))
            * moveScale;
    local_238._4_4_ = (int)((ulong)dVar2 >> 0x20);
    local_238._0_4_ = (float)dVar2;
    auVar71 = ZEXT856(0);
    local_238._8_8_ = 0;
    vVar272 = state::center();
    aVar73 = vVar272.field_2;
    auVar63._0_8_ = vVar272._0_8_;
    auVar63._8_56_ = auVar71;
    aVar37 = vVar272.field_0;
    auVar20 = vmovshdup_avx(auVar63._0_16_);
    auVar84._0_4_ =
         viewMat._48_4_ +
         aVar37.x * viewMat + auVar20._0_4_ * viewMat._16_4_ + aVar73.z * viewMat._32_4_;
    auVar84._4_4_ =
         viewMat._52_4_ +
         aVar37.x * viewMat._4_4_ + auVar20._4_4_ * viewMat._20_4_ + aVar73.z * viewMat._36_4_;
    auVar84._8_4_ = aVar37.x * 0.0 + auVar20._8_4_ * 0.0 + aVar73.z * 0.0 + 0.0;
    auVar84._12_4_ = aVar37.x * 0.0 + auVar20._12_4_ * 0.0 + aVar73.z * 0.0 + 0.0;
    auVar43._0_4_ =
         aVar37.x * viewMat._8_4_ + auVar20._0_4_ * viewMat._24_4_ + aVar73.z * viewMat._40_4_ +
         viewMat._56_4_;
    auVar43._4_4_ =
         aVar37.x * viewMat._12_4_ + auVar20._4_4_ * viewMat._28_4_ + aVar73.z * viewMat._44_4_ +
         viewMat._60_4_;
    auVar43._8_4_ = aVar37.x * 0.0 + auVar20._8_4_ * 0.0 + aVar73.z * 0.0 + 0.0;
    auVar43._12_4_ = aVar37.x * 0.0 + auVar20._12_4_ * 0.0 + aVar73.z * 0.0 + 0.0;
    auVar20 = vmovlhps_avx(auVar84,auVar43);
    _DAT_006006d4 = auVar20;
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar20 = vxorps_avx512vl(local_238,auVar7);
    local_188._0_16_ = auVar20;
    fVar38 = cosf(auVar20._0_4_);
    fVar184 = sinf((float)local_188._0_4_);
    fVar41 = local_1a4.x * local_1a4.x + local_1a0 * local_1a0 + local_19c * local_19c;
    if (fVar41 < 0.0) {
      local_188._0_4_ = fVar184;
      fVar41 = sqrtf(fVar41);
    }
    else {
      auVar20 = vsqrtss_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
      fVar41 = auVar20._0_4_;
      local_188._0_4_ = fVar184;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dVar42;
    auVar23 = vcvtsd2ss_avx512f(auVar18,auVar1);
    fVar41 = 1.0 / fVar41;
    fVar184 = local_1a4.x * fVar41;
    local_1a0 = local_1a0 * fVar41;
    local_19c = local_19c * fVar41;
    fVar195 = 1.0 - fVar38;
    fVar41 = fVar195 * fVar184;
    fVar181 = fVar195 * local_1a0;
    fVar195 = fVar195 * local_19c;
    auVar22 = ZEXT416((uint)fVar184);
    auVar24 = ZEXT416((uint)fVar38);
    auVar20 = vfmadd213ss_fma(auVar22,ZEXT416((uint)fVar41),auVar24);
    auVar16 = ZEXT416((uint)local_1a0);
    auVar14 = vfmadd213ss_fma(auVar16,ZEXT416((uint)fVar41),
                              ZEXT416((uint)((float)local_188._0_4_ * local_19c)));
    auVar15 = ZEXT416((uint)local_19c);
    auVar21 = vfmsub213ss_fma(ZEXT416((uint)fVar41),auVar15,
                              ZEXT416((uint)((float)local_188._0_4_ * local_1a0)));
    auVar19 = vfmsub231ss_fma(ZEXT416((uint)((float)local_188._0_4_ * local_19c)),
                              ZEXT416((uint)fVar181),auVar22);
    auVar18 = vfmadd213ss_fma(auVar16,ZEXT416((uint)fVar181),auVar24);
    auVar17 = vfmadd213ss_fma(ZEXT416((uint)fVar181),auVar15,
                              ZEXT416((uint)((float)local_188._0_4_ * fVar184)));
    auVar22 = vfmadd213ss_fma(auVar22,ZEXT416((uint)fVar195),
                              ZEXT416((uint)((float)local_188._0_4_ * local_1a0)));
    auVar16 = vfmsub213ss_fma(auVar16,ZEXT416((uint)fVar195),
                              ZEXT416((uint)((float)local_188._0_4_ * fVar184)));
    auVar15 = vfmadd213ss_fma(auVar15,ZEXT416((uint)fVar195),auVar24);
    fVar184 = auVar20._0_4_ * 0.0;
    fVar38 = auVar14._0_4_ * 0.0;
    fVar41 = fVar38 + fVar184;
    fVar195 = auVar21._0_4_ * 0.0;
    fVar38 = fVar195 + fVar38 + auVar20._0_4_;
    fVar184 = fVar195 + auVar14._0_4_ + fVar184;
    fVar181 = auVar21._0_4_ + fVar41;
    fVar195 = fVar195 + fVar41;
    fVar196 = auVar19._0_4_ * 0.0;
    fVar182 = auVar18._0_4_ * 0.0;
    fVar41 = fVar182 + fVar196;
    fVar197 = auVar17._0_4_ * 0.0;
    fVar182 = fVar197 + auVar19._0_4_ + fVar182;
    fVar196 = fVar197 + auVar18._0_4_ + fVar196;
    fVar183 = auVar17._0_4_ + fVar41;
    fVar197 = fVar197 + fVar41;
    fVar109 = auVar22._0_4_ * 0.0;
    fVar97 = auVar16._0_4_ * 0.0;
    fVar41 = fVar97 + fVar109;
    fVar110 = auVar15._0_4_ * 0.0;
    fVar97 = fVar110 + fVar97 + auVar22._0_4_;
    fVar109 = fVar110 + auVar16._0_4_ + fVar109;
    auVar20 = vaddss_avx512f(auVar15,ZEXT416((uint)fVar41));
    fVar110 = fVar110 + fVar41;
    auVar144._4_4_ = fVar38;
    auVar144._0_4_ = fVar38;
    auVar144._8_4_ = fVar38;
    auVar144._12_4_ = fVar38;
    auVar236._8_8_ = 0;
    auVar236._0_8_ = _viewMat;
    auVar14 = vmulps_avx512vl(auVar236,auVar144);
    auVar163._4_4_ = fVar184;
    auVar163._0_4_ = fVar184;
    auVar163._8_4_ = fVar184;
    auVar163._12_4_ = fVar184;
    auVar244._8_8_ = 0;
    auVar244._0_8_ = DAT_006006b4;
    auVar18 = vmulps_avx512vl(auVar244,auVar163);
    auVar14 = vaddps_avx512vl(auVar14,auVar18);
    auVar113._4_4_ = fVar181;
    auVar113._0_4_ = fVar181;
    auVar113._8_4_ = fVar181;
    auVar113._12_4_ = fVar181;
    auVar252._8_8_ = 0;
    auVar252._0_8_ = DAT_006006c4;
    auVar18 = vmulps_avx512vl(auVar252,auVar113);
    auVar14 = vaddps_avx512vl(auVar18,auVar14);
    auVar185._4_4_ = fVar195;
    auVar185._0_4_ = fVar195;
    auVar185._8_4_ = fVar195;
    auVar185._12_4_ = fVar195;
    auVar260._8_8_ = 0;
    auVar260._0_8_ = DAT_006006d4;
    auVar18 = vmulps_avx512vl(auVar185,auVar260);
    auVar14 = vaddps_avx512vl(auVar18,auVar14);
    fVar39 = viewMat._8_4_;
    fVar40 = viewMat._12_4_;
    fVar41 = viewMat._24_4_;
    fVar162 = viewMat._28_4_;
    fVar70 = viewMat._40_4_;
    fVar82 = viewMat._44_4_;
    fVar111 = viewMat._56_4_;
    fVar215 = viewMat._60_4_;
    auVar114._0_4_ = fVar70 * fVar181 + fVar184 * fVar41 + fVar39 * fVar38 + fVar195 * fVar111;
    auVar114._4_4_ = fVar82 * fVar181 + fVar184 * fVar162 + fVar40 * fVar38 + fVar195 * fVar215;
    auVar114._8_4_ = fVar181 * 0.0 + fVar184 * 0.0 + fVar38 * 0.0 + fVar195 * 0.0;
    auVar114._12_4_ = fVar181 * 0.0 + fVar184 * 0.0 + fVar38 * 0.0 + fVar195 * 0.0;
    auVar145._4_4_ = fVar182;
    auVar145._0_4_ = fVar182;
    auVar145._8_4_ = fVar182;
    auVar145._12_4_ = fVar182;
    auVar18 = vmulps_avx512vl(auVar236,auVar145);
    auVar164._4_4_ = fVar196;
    auVar164._0_4_ = fVar196;
    auVar164._8_4_ = fVar196;
    auVar164._12_4_ = fVar196;
    auVar17 = vmulps_avx512vl(auVar244,auVar164);
    auVar124._4_4_ = fVar183;
    auVar124._0_4_ = fVar183;
    auVar124._8_4_ = fVar183;
    auVar124._12_4_ = fVar183;
    auVar22 = vmulps_avx512vl(auVar252,auVar124);
    auVar186._4_4_ = fVar197;
    auVar186._0_4_ = fVar197;
    auVar186._8_4_ = fVar197;
    auVar186._12_4_ = fVar197;
    auVar15 = vmulps_avx512vl(auVar186,auVar260);
    auVar125._0_4_ = fVar70 * fVar183 + fVar196 * fVar41 + fVar39 * fVar182 + fVar197 * fVar111;
    auVar125._4_4_ = fVar82 * fVar183 + fVar196 * fVar162 + fVar40 * fVar182 + fVar197 * fVar215;
    auVar125._8_4_ = fVar183 * 0.0 + fVar196 * 0.0 + fVar182 * 0.0 + fVar197 * 0.0;
    auVar125._12_4_ = fVar183 * 0.0 + fVar196 * 0.0 + fVar182 * 0.0 + fVar197 * 0.0;
    auVar146._4_4_ = fVar97;
    auVar146._0_4_ = fVar97;
    auVar146._8_4_ = fVar97;
    auVar146._12_4_ = fVar97;
    auVar237._8_8_ = 0;
    auVar237._0_8_ = _viewMat;
    auVar21 = vmulps_avx512vl(auVar237,auVar146);
    auVar187._4_4_ = fVar109;
    auVar187._0_4_ = fVar109;
    auVar187._8_4_ = fVar109;
    auVar187._12_4_ = fVar109;
    auVar245._8_8_ = 0;
    auVar245._0_8_ = DAT_006006b4;
    auVar16 = vmulps_avx512vl(auVar245,auVar187);
    auVar20 = vbroadcastss_avx512vl(auVar20);
    auVar253._8_8_ = 0;
    auVar253._0_8_ = DAT_006006c4;
    auVar19 = vmulps_avx512vl(auVar253,auVar20);
    auVar205._4_4_ = fVar110;
    auVar205._0_4_ = fVar110;
    auVar205._8_4_ = fVar110;
    auVar205._12_4_ = fVar110;
    auVar261._8_8_ = 0;
    auVar261._0_8_ = DAT_006006d4;
    auVar24 = vmulps_avx512vl(auVar205,auVar261);
    auVar147._0_4_ = fVar110 * fVar111 + auVar20._0_4_ * fVar70 + fVar109 * fVar41 + fVar39 * fVar97
    ;
    auVar147._4_4_ =
         fVar110 * fVar215 + auVar20._4_4_ * fVar82 + fVar109 * fVar162 + fVar40 * fVar97;
    auVar147._8_4_ = fVar110 * 0.0 + auVar20._8_4_ * 0.0 + fVar109 * 0.0 + fVar97 * 0.0;
    auVar147._12_4_ = fVar110 * 0.0 + auVar20._12_4_ * 0.0 + fVar109 * 0.0 + fVar97 * 0.0;
    auVar26 = ZEXT416(0) << 0x20;
    auVar20 = vmulps_avx512vl(auVar237,auVar26);
    auVar25 = vmulps_avx512vl(auVar245,auVar26);
    auVar26 = vmulps_avx512vl(auVar253,auVar26);
    auVar188._0_4_ = auVar20._0_4_ + auVar25._0_4_ + auVar26._0_4_;
    auVar188._4_4_ = auVar20._4_4_ + auVar25._4_4_ + auVar26._4_4_;
    auVar188._8_4_ = auVar20._8_4_ + auVar25._8_4_ + auVar26._8_4_;
    auVar188._12_4_ = auVar20._12_4_ + auVar25._12_4_ + auVar26._12_4_;
    auVar20 = vaddps_avx512vl(auVar188,auVar261);
    auVar47._0_4_ = fVar39 * 0.0 + fVar41 * 0.0 + fVar70 * 0.0 + fVar111;
    auVar47._4_4_ = fVar40 * 0.0 + fVar162 * 0.0 + fVar82 * 0.0 + fVar215;
    auVar47._8_8_ = 0;
    auVar32 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(auVar15._12_4_ +
                                            auVar22._12_4_ + auVar18._12_4_ + auVar17._12_4_,
                                            CONCAT48(auVar15._8_4_ +
                                                     auVar22._8_4_ + auVar18._8_4_ + auVar17._8_4_,
                                                     CONCAT44(auVar15._4_4_ +
                                                              auVar22._4_4_ +
                                                              auVar18._4_4_ + auVar17._4_4_,
                                                              auVar15._0_4_ +
                                                              auVar22._0_4_ +
                                                              auVar18._0_4_ + auVar17._0_4_)))),
                         auVar125,1);
    vinsertf32x4_avx512f(ZEXT1664(auVar14),auVar114,1);
    auVar29 = vpermt2pd_avx512f(_DAT_0033b6e0,auVar32._0_32_);
    vinsertf32x4_avx512f
              (ZEXT1664(CONCAT412(auVar24._12_4_ + auVar19._12_4_ + auVar21._12_4_ + auVar16._12_4_,
                                  CONCAT48(auVar24._8_4_ +
                                           auVar19._8_4_ + auVar21._8_4_ + auVar16._8_4_,
                                           CONCAT44(auVar24._4_4_ +
                                                    auVar19._4_4_ + auVar21._4_4_ + auVar16._4_4_,
                                                    auVar24._0_4_ +
                                                    auVar19._0_4_ + auVar21._0_4_ + auVar16._0_4_)))
                       ),auVar147,1);
    auVar32 = vinsertf32x4_avx512f(ZEXT1664(auVar20),auVar47,1);
    local_188 = vbroadcasti64x4_avx512f(_DAT_0033b6c0);
    auVar32 = vpermt2pd_avx512f(local_188,auVar32);
    _viewMat = vinsertf64x4_avx512f(auVar32,auVar29,0);
    switch(upDir) {
    case 0:
      local_238 = SUB6416(ZEXT464(0x3f800000),0);
      break;
    case 1:
      local_238 = ZEXT816(0x3f80000000000000);
      break;
    case 2:
      local_238 = ZEXT816(0);
      local_1e8._0_4_ = 1.0;
      goto LAB_001f93d4;
    case 3:
      local_238 = SUB6416(ZEXT464(0xbf800000),0);
      break;
    case 4:
      local_238 = ZEXT816(0xbf80000000000000);
      break;
    case 5:
      local_238 = ZEXT816(0);
      local_1e8._0_4_ = -1.0;
      goto LAB_001f93d4;
    default:
      local_238 = ZEXT816(0);
    }
    local_1e8._0_4_ = 0.0;
LAB_001f93d4:
    fVar181 = cosf(auVar23._0_4_);
    fVar195 = sinf(auVar23._0_4_);
    fVar38 = local_238._0_4_;
    auVar20 = vmovshdup_avx(local_238);
    fVar184 = auVar20._0_4_;
    fVar41 = (float)local_1e8._0_4_ * (float)local_1e8._0_4_ + fVar38 * fVar38 + fVar184 * fVar184;
    if (fVar41 < 0.0) {
      fVar41 = sqrtf(fVar41);
    }
    else {
      auVar20 = vsqrtss_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
      fVar41 = auVar20._0_4_;
    }
    fVar41 = 1.0 / fVar41;
    fVar38 = fVar38 * fVar41;
    fVar184 = fVar184 * fVar41;
    local_1e8._0_4_ = (float)local_1e8._0_4_ * fVar41;
    fVar196 = 1.0 - fVar181;
    fVar41 = fVar196 * fVar38;
    fVar182 = fVar196 * fVar184;
    fVar196 = fVar196 * (float)local_1e8._0_4_;
    auVar22 = ZEXT416((uint)fVar38);
    auVar23 = ZEXT416((uint)fVar181);
    auVar20 = vfmadd213ss_fma(auVar22,ZEXT416((uint)fVar41),auVar23);
    auVar16 = ZEXT416((uint)fVar184);
    auVar14 = vfmadd213ss_fma(auVar16,ZEXT416((uint)fVar41),
                              ZEXT416((uint)(fVar195 * (float)local_1e8._0_4_)));
    auVar15 = ZEXT416((uint)local_1e8._0_4_);
    auVar21 = vfmsub213ss_fma(ZEXT416((uint)fVar41),auVar15,ZEXT416((uint)(fVar195 * fVar184)));
    auVar19 = vfmsub231ss_fma(ZEXT416((uint)(fVar195 * (float)local_1e8._0_4_)),
                              ZEXT416((uint)fVar182),auVar22);
    auVar18 = vfmadd213ss_fma(auVar16,ZEXT416((uint)fVar182),auVar23);
    auVar17 = vfmadd213ss_fma(ZEXT416((uint)fVar182),auVar15,ZEXT416((uint)(fVar195 * fVar38)));
    auVar22 = vfmadd213ss_fma(auVar22,ZEXT416((uint)fVar196),ZEXT416((uint)(fVar195 * fVar184)));
    auVar16 = vfmsub213ss_fma(auVar16,ZEXT416((uint)fVar196),ZEXT416((uint)(fVar195 * fVar38)));
    auVar15 = vfmadd213ss_fma(auVar15,ZEXT416((uint)fVar196),auVar23);
    fVar184 = auVar20._0_4_ * 0.0;
    fVar38 = auVar14._0_4_ * 0.0;
    fVar41 = fVar38 + fVar184;
    fVar195 = auVar21._0_4_ * 0.0;
    fVar38 = fVar195 + fVar38 + auVar20._0_4_;
    fVar184 = fVar195 + auVar14._0_4_ + fVar184;
    fVar181 = auVar21._0_4_ + fVar41;
    fVar195 = fVar195 + fVar41;
    fVar196 = auVar19._0_4_ * 0.0;
    fVar182 = auVar18._0_4_ * 0.0;
    fVar41 = fVar182 + fVar196;
    fVar197 = auVar17._0_4_ * 0.0;
    fVar182 = fVar197 + fVar182 + auVar19._0_4_;
    fVar196 = fVar197 + auVar18._0_4_ + fVar196;
    fVar183 = auVar17._0_4_ + fVar41;
    fVar197 = fVar197 + fVar41;
    fVar109 = auVar22._0_4_ * 0.0;
    fVar97 = auVar16._0_4_ * 0.0;
    fVar41 = fVar97 + fVar109;
    fVar111 = auVar15._0_4_ * 0.0;
    fVar97 = fVar111 + fVar97 + auVar22._0_4_;
    fVar109 = fVar111 + auVar16._0_4_ + fVar109;
    fVar110 = auVar15._0_4_ + fVar41;
    fVar111 = fVar111 + fVar41;
    auVar137._4_4_ = fVar38;
    auVar137._0_4_ = fVar38;
    auVar137._8_4_ = fVar38;
    auVar137._12_4_ = fVar38;
    auVar234._8_8_ = 0;
    auVar234._0_8_ = _viewMat;
    auVar20 = vmulps_avx512vl(auVar234,auVar137);
    auVar158._4_4_ = fVar184;
    auVar158._0_4_ = fVar184;
    auVar158._8_4_ = fVar184;
    auVar158._12_4_ = fVar184;
    auVar242._8_8_ = 0;
    auVar242._0_8_ = DAT_006006b4;
    auVar14 = vmulps_avx512vl(auVar242,auVar158);
    auVar20 = vaddps_avx512vl(auVar20,auVar14);
    auVar104._4_4_ = fVar181;
    auVar104._0_4_ = fVar181;
    auVar104._8_4_ = fVar181;
    auVar104._12_4_ = fVar181;
    auVar250._8_8_ = 0;
    auVar250._0_8_ = DAT_006006c4;
    auVar14 = vmulps_avx512vl(auVar250,auVar104);
    auVar20 = vaddps_avx512vl(auVar14,auVar20);
    auVar175._4_4_ = fVar195;
    auVar175._0_4_ = fVar195;
    auVar175._8_4_ = fVar195;
    auVar175._12_4_ = fVar195;
    auVar258._8_8_ = 0;
    auVar258._0_8_ = DAT_006006d4;
    auVar14 = vmulps_avx512vl(auVar175,auVar258);
    auVar20 = vaddps_avx512vl(auVar14,auVar20);
    fVar40 = viewMat._8_4_;
    fVar70 = viewMat._12_4_;
    fVar41 = viewMat._24_4_;
    fVar215 = viewMat._28_4_;
    fVar82 = viewMat._40_4_;
    fVar91 = viewMat._44_4_;
    fVar162 = viewMat._56_4_;
    fVar39 = viewMat._60_4_;
    auVar105._0_4_ = fVar82 * fVar181 + fVar184 * fVar41 + fVar40 * fVar38 + fVar195 * fVar162;
    auVar105._4_4_ = fVar91 * fVar181 + fVar184 * fVar215 + fVar70 * fVar38 + fVar195 * fVar39;
    auVar105._8_4_ = fVar181 * 0.0 + fVar184 * 0.0 + fVar38 * 0.0 + fVar195 * 0.0;
    auVar105._12_4_ = fVar181 * 0.0 + fVar184 * 0.0 + fVar38 * 0.0 + fVar195 * 0.0;
    auVar138._4_4_ = fVar182;
    auVar138._0_4_ = fVar182;
    auVar138._8_4_ = fVar182;
    auVar138._12_4_ = fVar182;
    auVar14 = vmulps_avx512vl(auVar234,auVar138);
    auVar159._4_4_ = fVar196;
    auVar159._0_4_ = fVar196;
    auVar159._8_4_ = fVar196;
    auVar159._12_4_ = fVar196;
    auVar18 = vmulps_avx512vl(auVar242,auVar159);
    auVar120._4_4_ = fVar183;
    auVar120._0_4_ = fVar183;
    auVar120._8_4_ = fVar183;
    auVar120._12_4_ = fVar183;
    auVar17 = vmulps_avx512vl(auVar250,auVar120);
    auVar176._4_4_ = fVar197;
    auVar176._0_4_ = fVar197;
    auVar176._8_4_ = fVar197;
    auVar176._12_4_ = fVar197;
    auVar22 = vmulps_avx512vl(auVar176,auVar258);
    auVar121._0_4_ = fVar82 * fVar183 + fVar196 * fVar41 + fVar40 * fVar182 + fVar197 * fVar162;
    auVar121._4_4_ = fVar91 * fVar183 + fVar196 * fVar215 + fVar70 * fVar182 + fVar197 * fVar39;
    auVar121._8_4_ = fVar183 * 0.0 + fVar196 * 0.0 + fVar182 * 0.0 + fVar197 * 0.0;
    auVar121._12_4_ = fVar183 * 0.0 + fVar196 * 0.0 + fVar182 * 0.0 + fVar197 * 0.0;
    auVar139._4_4_ = fVar97;
    auVar139._0_4_ = fVar97;
    auVar139._8_4_ = fVar97;
    auVar139._12_4_ = fVar97;
    auVar235._8_8_ = 0;
    auVar235._0_8_ = _viewMat;
    auVar15 = vmulps_avx512vl(auVar235,auVar139);
    auVar177._4_4_ = fVar109;
    auVar177._0_4_ = fVar109;
    auVar177._8_4_ = fVar109;
    auVar177._12_4_ = fVar109;
    auVar243._8_8_ = 0;
    auVar243._0_8_ = DAT_006006b4;
    auVar21 = vmulps_avx512vl(auVar243,auVar177);
    auVar192._4_4_ = fVar110;
    auVar192._0_4_ = fVar110;
    auVar192._8_4_ = fVar110;
    auVar192._12_4_ = fVar110;
    auVar251._8_8_ = 0;
    auVar251._0_8_ = DAT_006006c4;
    auVar16 = vmulps_avx512vl(auVar251,auVar192);
    auVar200._4_4_ = fVar111;
    auVar200._0_4_ = fVar111;
    auVar200._8_4_ = fVar111;
    auVar200._12_4_ = fVar111;
    auVar259._8_8_ = 0;
    auVar259._0_8_ = DAT_006006d4;
    auVar19 = vmulps_avx512vl(auVar200,auVar259);
    auVar140._0_4_ = fVar111 * fVar162 + fVar110 * fVar82 + fVar109 * fVar41 + fVar40 * fVar97;
    auVar140._4_4_ = fVar111 * fVar39 + fVar110 * fVar91 + fVar109 * fVar215 + fVar70 * fVar97;
    auVar140._8_4_ = fVar111 * 0.0 + fVar110 * 0.0 + fVar109 * 0.0 + fVar97 * 0.0;
    auVar140._12_4_ = fVar111 * 0.0 + fVar110 * 0.0 + fVar109 * 0.0 + fVar97 * 0.0;
    auVar25 = ZEXT416(0) << 0x20;
    auVar23 = vmulps_avx512vl(auVar235,auVar25);
    auVar24 = vmulps_avx512vl(auVar243,auVar25);
    auVar25 = vmulps_avx512vl(auVar251,auVar25);
    auVar193._0_4_ = auVar23._0_4_ + auVar24._0_4_ + auVar25._0_4_;
    auVar193._4_4_ = auVar23._4_4_ + auVar24._4_4_ + auVar25._4_4_;
    auVar193._8_4_ = auVar23._8_4_ + auVar24._8_4_ + auVar25._8_4_;
    auVar193._12_4_ = auVar23._12_4_ + auVar24._12_4_ + auVar25._12_4_;
    auVar23 = vaddps_avx512vl(auVar193,auVar259);
    auVar60._0_4_ = fVar40 * 0.0 + fVar41 * 0.0 + fVar82 * 0.0 + fVar162;
    auVar60._4_4_ = fVar70 * 0.0 + fVar215 * 0.0 + fVar91 * 0.0 + fVar39;
    auVar60._8_8_ = 0;
    auVar32 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(auVar22._12_4_ +
                                            auVar17._12_4_ + auVar18._12_4_ + auVar14._12_4_,
                                            CONCAT48(auVar22._8_4_ +
                                                     auVar17._8_4_ + auVar18._8_4_ + auVar14._8_4_,
                                                     CONCAT44(auVar22._4_4_ +
                                                              auVar17._4_4_ +
                                                              auVar18._4_4_ + auVar14._4_4_,
                                                              auVar22._0_4_ +
                                                              auVar17._0_4_ +
                                                              auVar18._0_4_ + auVar14._0_4_)))),
                         auVar121,1);
    vinsertf32x4_avx512f(ZEXT1664(auVar20),auVar105,1);
    auVar29 = vpermt2pd_avx512f(_DAT_0033b6e0,auVar32._0_32_);
    vinsertf32x4_avx512f
              (ZEXT1664(CONCAT412(auVar19._12_4_ + auVar16._12_4_ + auVar15._12_4_ + auVar21._12_4_,
                                  CONCAT48(auVar19._8_4_ +
                                           auVar16._8_4_ + auVar15._8_4_ + auVar21._8_4_,
                                           CONCAT44(auVar19._4_4_ +
                                                    auVar16._4_4_ + auVar15._4_4_ + auVar21._4_4_,
                                                    auVar19._0_4_ +
                                                    auVar16._0_4_ + auVar15._0_4_ + auVar21._0_4_)))
                       ),auVar140,1);
    auVar32 = vinsertf32x4_avx512f(ZEXT1664(auVar23),auVar60,1);
    auVar32 = vpermt2pd_avx512f(local_188,auVar32);
LAB_001f9701:
    _viewMat = vinsertf64x4_avx512f(auVar32,auVar29,0);
    auVar71 = ZEXT856(viewMat._8_8_);
    vVar272 = state::center();
    aVar73 = vVar272.field_2;
    auVar68._0_8_ = vVar272._0_8_;
    auVar68._8_56_ = auVar71;
    auVar20 = vshufps_avx(auVar68._0_16_,auVar68._0_16_,0x55);
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar14 = vxorps_avx512vl(auVar20,auVar6);
    auVar106._0_4_ = auVar14._0_4_ * viewMat._16_4_;
    auVar106._4_4_ = auVar14._4_4_ * viewMat._20_4_;
    auVar106._8_4_ = auVar14._8_4_ * 0.0;
    auVar106._12_4_ = auVar14._12_4_ * 0.0;
    aVar37 = vVar272.field_0;
    auVar89._0_4_ = aVar37.x * viewMat;
    auVar89._4_4_ = aVar37.x * viewMat._4_4_;
    auVar89._8_4_ = aVar37.x * 0.0;
    auVar89._12_4_ = aVar37.x * 0.0;
    auVar20 = vsubps_avx(auVar106,auVar89);
    auVar107._0_4_ = aVar73.z * viewMat._32_4_;
    auVar107._4_4_ = aVar73.z * viewMat._36_4_;
    auVar107._8_4_ = aVar73.z * 0.0;
    auVar107._12_4_ = aVar73.z * 0.0;
    auVar20 = vsubps_avx(auVar20,auVar107);
    auVar90._0_4_ = viewMat._48_4_ + auVar20._0_4_;
    auVar90._4_4_ = viewMat._52_4_ + auVar20._4_4_;
    auVar90._8_4_ = auVar20._8_4_ + 0.0;
    auVar90._12_4_ = auVar20._12_4_ + 0.0;
    auVar108._0_4_ = auVar14._0_4_ * viewMat._24_4_;
    auVar108._4_4_ = auVar14._4_4_ * viewMat._28_4_;
    auVar108._8_4_ = auVar14._8_4_ * 0.0;
    auVar108._12_4_ = auVar14._12_4_ * 0.0;
    auVar61._0_4_ = aVar37.x * viewMat._8_4_;
    auVar61._4_4_ = aVar37.x * viewMat._12_4_;
    auVar61._8_4_ = aVar37.x * 0.0;
    auVar61._12_4_ = aVar37.x * 0.0;
    auVar20 = vsubps_avx(auVar108,auVar61);
    auVar81._0_4_ = aVar73.z * viewMat._40_4_;
    auVar81._4_4_ = aVar73.z * viewMat._44_4_;
    auVar81._8_4_ = aVar73.z * 0.0;
    auVar81._12_4_ = aVar73.z * 0.0;
    auVar20 = vsubps_avx(auVar20,auVar81);
    auVar62._0_4_ = auVar20._0_4_ + viewMat._56_4_;
    auVar62._4_4_ = auVar20._4_4_ + viewMat._60_4_;
    auVar62._8_4_ = auVar20._8_4_ + 0.0;
    auVar62._12_4_ = auVar20._12_4_ + 0.0;
    auVar20 = vmovlhps_avx(auVar90,auVar62);
    _DAT_006006d4 = auVar20;
    break;
  case 1:
    fVar38 = (float)(((double)(aVar72.x - aVar36.x) + (double)(aVar72.x - aVar36.x)) * moveScale);
    dVar42 = ((double)(fVar41 - (float)local_188._0_4_) + (double)(fVar41 - (float)local_188._0_4_))
             * moveScale;
    local_238._4_4_ = (int)((ulong)dVar42 >> 0x20);
    local_238._0_4_ = (float)dVar42;
    auVar71 = ZEXT856(0);
    local_238._8_8_ = 0;
    vVar272 = state::center();
    aVar73 = vVar272.field_2;
    auVar64._0_8_ = vVar272._0_8_;
    auVar64._8_56_ = auVar71;
    aVar37 = vVar272.field_0;
    auVar20 = vmovshdup_avx(auVar64._0_16_);
    auVar85._0_4_ =
         viewMat._48_4_ +
         aVar37.x * viewMat + auVar20._0_4_ * viewMat._16_4_ + aVar73.z * viewMat._32_4_;
    auVar85._4_4_ =
         viewMat._52_4_ +
         aVar37.x * viewMat._4_4_ + auVar20._4_4_ * viewMat._20_4_ + aVar73.z * viewMat._36_4_;
    auVar85._8_4_ = aVar37.x * 0.0 + auVar20._8_4_ * 0.0 + aVar73.z * 0.0 + 0.0;
    auVar85._12_4_ = aVar37.x * 0.0 + auVar20._12_4_ * 0.0 + aVar73.z * 0.0 + 0.0;
    auVar45._0_4_ =
         aVar37.x * viewMat._8_4_ + auVar20._0_4_ * viewMat._24_4_ + aVar73.z * viewMat._40_4_ +
         viewMat._56_4_;
    auVar45._4_4_ =
         aVar37.x * viewMat._12_4_ + auVar20._4_4_ * viewMat._28_4_ + aVar73.z * viewMat._44_4_ +
         viewMat._60_4_;
    auVar45._8_4_ = aVar37.x * 0.0 + auVar20._8_4_ * 0.0 + aVar73.z * 0.0 + 0.0;
    auVar45._12_4_ = aVar37.x * 0.0 + auVar20._12_4_ * 0.0 + aVar73.z * 0.0 + 0.0;
    auVar20 = vmovlhps_avx(auVar85,auVar45);
    _DAT_006006d4 = auVar20;
    fVar41 = cosf(fVar38);
    local_188._0_4_ = fVar41;
    fVar38 = sinf(fVar38);
    fVar41 = local_114.x * local_114.x + local_110 * local_110 + local_10c * local_10c;
    if (fVar41 < 0.0) {
      fVar41 = sqrtf(fVar41);
    }
    else {
      auVar20 = vsqrtss_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
      fVar41 = auVar20._0_4_;
    }
    fVar41 = 1.0 / fVar41;
    fVar184 = local_114.x * fVar41;
    local_110 = local_110 * fVar41;
    local_10c = local_10c * fVar41;
    fVar195 = 1.0 - (float)local_188._0_4_;
    fVar41 = fVar195 * fVar184;
    fVar181 = fVar195 * local_110;
    fVar195 = fVar195 * local_10c;
    auVar22 = ZEXT416((uint)fVar184);
    auVar23 = ZEXT416((uint)local_188._0_4_);
    auVar20 = vfmadd213ss_fma(auVar22,ZEXT416((uint)fVar41),auVar23);
    auVar16 = ZEXT416((uint)local_110);
    auVar14 = vfmadd213ss_fma(auVar16,ZEXT416((uint)fVar41),ZEXT416((uint)(fVar38 * local_10c)));
    auVar15 = ZEXT416((uint)local_10c);
    auVar21 = vfmsub213ss_fma(ZEXT416((uint)fVar41),auVar15,ZEXT416((uint)(fVar38 * local_110)));
    auVar19 = vfmsub231ss_fma(ZEXT416((uint)(fVar38 * local_10c)),ZEXT416((uint)fVar181),auVar22);
    auVar18 = vfmadd213ss_fma(auVar16,ZEXT416((uint)fVar181),auVar23);
    auVar17 = vfmadd213ss_fma(ZEXT416((uint)fVar181),auVar15,ZEXT416((uint)(fVar38 * fVar184)));
    auVar22 = vfmadd213ss_fma(auVar22,ZEXT416((uint)fVar195),ZEXT416((uint)(fVar38 * local_110)));
    auVar16 = vfmsub213ss_fma(auVar16,ZEXT416((uint)fVar195),ZEXT416((uint)(fVar38 * fVar184)));
    auVar15 = vfmadd213ss_fma(auVar15,ZEXT416((uint)fVar195),auVar23);
    fVar184 = auVar20._0_4_ * 0.0;
    fVar38 = auVar14._0_4_ * 0.0;
    fVar41 = fVar38 + fVar184;
    fVar195 = auVar21._0_4_ * 0.0;
    fVar38 = fVar195 + fVar38 + auVar20._0_4_;
    fVar184 = fVar195 + auVar14._0_4_ + fVar184;
    fVar181 = auVar21._0_4_ + fVar41;
    fVar195 = fVar195 + fVar41;
    fVar196 = auVar19._0_4_ * 0.0;
    fVar182 = auVar18._0_4_ * 0.0;
    fVar41 = fVar182 + fVar196;
    fVar197 = auVar17._0_4_ * 0.0;
    fVar182 = fVar197 + fVar182 + auVar19._0_4_;
    fVar196 = fVar197 + auVar18._0_4_ + fVar196;
    fVar183 = auVar17._0_4_ + fVar41;
    fVar197 = fVar197 + fVar41;
    fVar109 = auVar22._0_4_ * 0.0;
    fVar97 = auVar16._0_4_ * 0.0;
    fVar41 = fVar97 + fVar109;
    fVar111 = auVar15._0_4_ * 0.0;
    fVar97 = fVar111 + fVar97 + auVar22._0_4_;
    fVar109 = fVar111 + auVar16._0_4_ + fVar109;
    fVar110 = auVar15._0_4_ + fVar41;
    fVar111 = fVar111 + fVar41;
    auVar126._4_4_ = fVar38;
    auVar126._0_4_ = fVar38;
    auVar126._8_4_ = fVar38;
    auVar126._12_4_ = fVar38;
    auVar228._8_8_ = 0;
    auVar228._0_8_ = _viewMat;
    auVar20 = vmulps_avx512vl(auVar228,auVar126);
    auVar152._4_4_ = fVar184;
    auVar152._0_4_ = fVar184;
    auVar152._8_4_ = fVar184;
    auVar152._12_4_ = fVar184;
    auVar238._8_8_ = 0;
    auVar238._0_8_ = DAT_006006b4;
    auVar14 = vmulps_avx512vl(auVar238,auVar152);
    auVar20 = vaddps_avx512vl(auVar20,auVar14);
    auVar98._4_4_ = fVar181;
    auVar98._0_4_ = fVar181;
    auVar98._8_4_ = fVar181;
    auVar98._12_4_ = fVar181;
    auVar246._8_8_ = 0;
    auVar246._0_8_ = DAT_006006c4;
    auVar14 = vmulps_avx512vl(auVar246,auVar98);
    auVar20 = vaddps_avx512vl(auVar14,auVar20);
    auVar165._4_4_ = fVar195;
    auVar165._0_4_ = fVar195;
    auVar165._8_4_ = fVar195;
    auVar165._12_4_ = fVar195;
    auVar254._8_8_ = 0;
    auVar254._0_8_ = DAT_006006d4;
    auVar14 = vmulps_avx512vl(auVar165,auVar254);
    auVar20 = vaddps_avx512vl(auVar14,auVar20);
    fVar40 = viewMat._8_4_;
    fVar70 = viewMat._12_4_;
    fVar41 = viewMat._24_4_;
    fVar215 = viewMat._28_4_;
    fVar82 = viewMat._40_4_;
    fVar91 = viewMat._44_4_;
    fVar162 = viewMat._56_4_;
    fVar39 = viewMat._60_4_;
    auVar99._0_4_ = fVar82 * fVar181 + fVar184 * fVar41 + fVar40 * fVar38 + fVar195 * fVar162;
    auVar99._4_4_ = fVar91 * fVar181 + fVar184 * fVar215 + fVar70 * fVar38 + fVar195 * fVar39;
    auVar99._8_4_ = fVar181 * 0.0 + fVar184 * 0.0 + fVar38 * 0.0 + fVar195 * 0.0;
    auVar99._12_4_ = fVar181 * 0.0 + fVar184 * 0.0 + fVar38 * 0.0 + fVar195 * 0.0;
    auVar127._4_4_ = fVar182;
    auVar127._0_4_ = fVar182;
    auVar127._8_4_ = fVar182;
    auVar127._12_4_ = fVar182;
    auVar14 = vmulps_avx512vl(auVar228,auVar127);
    auVar153._4_4_ = fVar196;
    auVar153._0_4_ = fVar196;
    auVar153._8_4_ = fVar196;
    auVar153._12_4_ = fVar196;
    auVar18 = vmulps_avx512vl(auVar238,auVar153);
    auVar115._4_4_ = fVar183;
    auVar115._0_4_ = fVar183;
    auVar115._8_4_ = fVar183;
    auVar115._12_4_ = fVar183;
    auVar17 = vmulps_avx512vl(auVar246,auVar115);
    auVar166._4_4_ = fVar197;
    auVar166._0_4_ = fVar197;
    auVar166._8_4_ = fVar197;
    auVar166._12_4_ = fVar197;
    auVar22 = vmulps_avx512vl(auVar166,auVar254);
    auVar116._0_4_ = fVar82 * fVar183 + fVar196 * fVar41 + fVar40 * fVar182 + fVar197 * fVar162;
    auVar116._4_4_ = fVar91 * fVar183 + fVar196 * fVar215 + fVar70 * fVar182 + fVar197 * fVar39;
    auVar116._8_4_ = fVar183 * 0.0 + fVar196 * 0.0 + fVar182 * 0.0 + fVar197 * 0.0;
    auVar116._12_4_ = fVar183 * 0.0 + fVar196 * 0.0 + fVar182 * 0.0 + fVar197 * 0.0;
    auVar128._4_4_ = fVar97;
    auVar128._0_4_ = fVar97;
    auVar128._8_4_ = fVar97;
    auVar128._12_4_ = fVar97;
    auVar229._8_8_ = 0;
    auVar229._0_8_ = _viewMat;
    auVar15 = vmulps_avx512vl(auVar229,auVar128);
    auVar167._4_4_ = fVar109;
    auVar167._0_4_ = fVar109;
    auVar167._8_4_ = fVar109;
    auVar167._12_4_ = fVar109;
    auVar239._8_8_ = 0;
    auVar239._0_8_ = DAT_006006b4;
    auVar21 = vmulps_avx512vl(auVar239,auVar167);
    auVar189._4_4_ = fVar110;
    auVar189._0_4_ = fVar110;
    auVar189._8_4_ = fVar110;
    auVar189._12_4_ = fVar110;
    auVar247._8_8_ = 0;
    auVar247._0_8_ = DAT_006006c4;
    auVar16 = vmulps_avx512vl(auVar247,auVar189);
    auVar198._4_4_ = fVar111;
    auVar198._0_4_ = fVar111;
    auVar198._8_4_ = fVar111;
    auVar198._12_4_ = fVar111;
    auVar255._8_8_ = 0;
    auVar255._0_8_ = DAT_006006d4;
    auVar19 = vmulps_avx512vl(auVar198,auVar255);
    auVar129._0_4_ = fVar111 * fVar162 + fVar110 * fVar82 + fVar109 * fVar41 + fVar40 * fVar97;
    auVar129._4_4_ = fVar111 * fVar39 + fVar110 * fVar91 + fVar109 * fVar215 + fVar70 * fVar97;
    auVar129._8_4_ = fVar111 * 0.0 + fVar110 * 0.0 + fVar109 * 0.0 + fVar97 * 0.0;
    auVar129._12_4_ = fVar111 * 0.0 + fVar110 * 0.0 + fVar109 * 0.0 + fVar97 * 0.0;
    auVar25 = ZEXT416(0) << 0x20;
    auVar23 = vmulps_avx512vl(auVar229,auVar25);
    auVar24 = vmulps_avx512vl(auVar239,auVar25);
    auVar25 = vmulps_avx512vl(auVar247,auVar25);
    auVar168._0_4_ = auVar23._0_4_ + auVar24._0_4_ + auVar25._0_4_;
    auVar168._4_4_ = auVar23._4_4_ + auVar24._4_4_ + auVar25._4_4_;
    auVar168._8_4_ = auVar23._8_4_ + auVar24._8_4_ + auVar25._8_4_;
    auVar168._12_4_ = auVar23._12_4_ + auVar24._12_4_ + auVar25._12_4_;
    auVar23 = vaddps_avx512vl(auVar168,auVar255);
    auVar48._0_4_ = fVar40 * 0.0 + fVar41 * 0.0 + fVar82 * 0.0 + fVar162;
    auVar48._4_4_ = fVar70 * 0.0 + fVar215 * 0.0 + fVar91 * 0.0 + fVar39;
    auVar48._8_8_ = 0;
    auVar32 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(auVar22._12_4_ +
                                            auVar17._12_4_ + auVar18._12_4_ + auVar14._12_4_,
                                            CONCAT48(auVar22._8_4_ +
                                                     auVar17._8_4_ + auVar18._8_4_ + auVar14._8_4_,
                                                     CONCAT44(auVar22._4_4_ +
                                                              auVar17._4_4_ +
                                                              auVar18._4_4_ + auVar14._4_4_,
                                                              auVar22._0_4_ +
                                                              auVar17._0_4_ +
                                                              auVar18._0_4_ + auVar14._0_4_)))),
                         auVar116,1);
    vinsertf32x4_avx512f(ZEXT1664(auVar20),auVar99,1);
    auVar29 = vpermt2pd_avx512f(_DAT_0033b6e0,auVar32._0_32_);
    vinsertf32x4_avx512f
              (ZEXT1664(CONCAT412(auVar19._12_4_ + auVar16._12_4_ + auVar15._12_4_ + auVar21._12_4_,
                                  CONCAT48(auVar19._8_4_ +
                                           auVar16._8_4_ + auVar15._8_4_ + auVar21._8_4_,
                                           CONCAT44(auVar19._4_4_ +
                                                    auVar16._4_4_ + auVar15._4_4_ + auVar21._4_4_,
                                                    auVar19._0_4_ +
                                                    auVar16._0_4_ + auVar15._0_4_ + auVar21._0_4_)))
                       ),auVar129,1);
    auVar33 = vinsertf32x4_avx512f(ZEXT1664(auVar23),auVar48,1);
    auVar34 = vbroadcasti64x4_avx512f(_DAT_0033b6c0);
    auVar32 = vmovdqu64_avx512f(auVar34);
    auVar33 = vpermt2pd_avx512f(auVar34,auVar33);
    _viewMat = vinsertf64x4_avx512f(auVar33,auVar29,0);
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar20 = vxorps_avx512vl(local_238,auVar5);
    local_188._0_16_ = auVar20;
    fVar184 = cosf(auVar20._0_4_);
    fVar38 = sinf((float)local_188._0_4_);
    fVar41 = local_1a4.x * local_1a4.x + local_1a0 * local_1a0 + local_19c * local_19c;
    if (fVar41 < 0.0) {
      local_188._0_4_ = fVar38;
      fVar41 = sqrtf(fVar41);
      fVar38 = (float)local_188._0_4_;
    }
    else {
      auVar20 = vsqrtss_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
      fVar41 = auVar20._0_4_;
    }
    fVar41 = 1.0 / fVar41;
    fVar181 = local_1a4.x * fVar41;
    local_1a0 = local_1a0 * fVar41;
    local_19c = local_19c * fVar41;
    fVar182 = 1.0 - fVar184;
    fVar41 = fVar182 * fVar181;
    fVar195 = fVar182 * local_1a0;
    fVar182 = fVar182 * local_19c;
    auVar22 = ZEXT416((uint)fVar181);
    auVar23 = ZEXT416((uint)fVar184);
    auVar20 = vfmadd213ss_fma(auVar22,ZEXT416((uint)fVar41),auVar23);
    auVar16 = ZEXT416((uint)local_1a0);
    auVar14 = vfmadd213ss_fma(auVar16,ZEXT416((uint)fVar41),ZEXT416((uint)(fVar38 * local_19c)));
    auVar15 = ZEXT416((uint)local_19c);
    auVar21 = vfmsub213ss_fma(ZEXT416((uint)fVar41),auVar15,ZEXT416((uint)(fVar38 * local_1a0)));
    auVar19 = vfmsub231ss_fma(ZEXT416((uint)(fVar38 * local_19c)),ZEXT416((uint)fVar195),auVar22);
    auVar18 = vfmadd213ss_fma(auVar16,ZEXT416((uint)fVar195),auVar23);
    auVar17 = vfmadd213ss_fma(ZEXT416((uint)fVar195),auVar15,ZEXT416((uint)(fVar38 * fVar181)));
    auVar22 = vfmadd213ss_fma(auVar22,ZEXT416((uint)fVar182),ZEXT416((uint)(fVar38 * local_1a0)));
    auVar16 = vfmsub213ss_fma(auVar16,ZEXT416((uint)fVar182),ZEXT416((uint)(fVar38 * fVar181)));
    auVar15 = vfmadd213ss_fma(auVar15,ZEXT416((uint)fVar182),auVar23);
    fVar184 = auVar20._0_4_ * 0.0;
    fVar38 = auVar14._0_4_ * 0.0;
    fVar41 = fVar184 + fVar38;
    fVar195 = auVar21._0_4_ * 0.0;
    fVar38 = fVar195 + fVar38 + auVar20._0_4_;
    fVar184 = fVar195 + auVar14._0_4_ + fVar184;
    fVar181 = fVar41 + auVar21._0_4_;
    fVar195 = fVar195 + fVar41;
    fVar196 = auVar19._0_4_ * 0.0;
    fVar182 = auVar18._0_4_ * 0.0;
    fVar41 = fVar196 + fVar182;
    fVar197 = auVar17._0_4_ * 0.0;
    fVar182 = fVar197 + fVar182 + auVar19._0_4_;
    fVar196 = fVar197 + auVar18._0_4_ + fVar196;
    fVar183 = fVar41 + auVar17._0_4_;
    fVar197 = fVar197 + fVar41;
    fVar97 = auVar22._0_4_ * 0.0;
    fVar41 = auVar16._0_4_ * 0.0;
    fVar110 = fVar97 + fVar41;
    fVar111 = auVar15._0_4_ * 0.0;
    fVar41 = fVar111 + fVar41 + auVar22._0_4_;
    fVar97 = fVar111 + fVar97 + auVar16._0_4_;
    fVar109 = fVar110 + auVar15._0_4_;
    fVar110 = fVar110 + fVar111;
    auVar130._4_4_ = fVar38;
    auVar130._0_4_ = fVar38;
    auVar130._8_4_ = fVar38;
    auVar130._12_4_ = fVar38;
    auVar230._8_8_ = 0;
    auVar230._0_8_ = _viewMat;
    auVar20 = vmulps_avx512vl(auVar230,auVar130);
    auVar154._4_4_ = fVar184;
    auVar154._0_4_ = fVar184;
    auVar154._8_4_ = fVar184;
    auVar154._12_4_ = fVar184;
    auVar240._8_8_ = 0;
    auVar240._0_8_ = DAT_006006b4;
    auVar14 = vmulps_avx512vl(auVar240,auVar154);
    auVar20 = vaddps_avx512vl(auVar20,auVar14);
    auVar100._4_4_ = fVar181;
    auVar100._0_4_ = fVar181;
    auVar100._8_4_ = fVar181;
    auVar100._12_4_ = fVar181;
    auVar248._8_8_ = 0;
    auVar248._0_8_ = DAT_006006c4;
    auVar14 = vmulps_avx512vl(auVar248,auVar100);
    auVar20 = vaddps_avx512vl(auVar14,auVar20);
    auVar169._4_4_ = fVar195;
    auVar169._0_4_ = fVar195;
    auVar169._8_4_ = fVar195;
    auVar169._12_4_ = fVar195;
    auVar256._8_8_ = 0;
    auVar256._0_8_ = DAT_006006d4;
    auVar14 = vmulps_avx512vl(auVar169,auVar256);
    auVar20 = vaddps_avx512vl(auVar14,auVar20);
    fVar40 = viewMat._8_4_;
    fVar70 = viewMat._12_4_;
    fVar111 = viewMat._24_4_;
    fVar215 = viewMat._28_4_;
    fVar82 = viewMat._40_4_;
    fVar91 = viewMat._44_4_;
    fVar162 = viewMat._56_4_;
    fVar39 = viewMat._60_4_;
    auVar101._0_4_ = fVar82 * fVar181 + fVar184 * fVar111 + fVar40 * fVar38 + fVar195 * fVar162;
    auVar101._4_4_ = fVar91 * fVar181 + fVar184 * fVar215 + fVar70 * fVar38 + fVar195 * fVar39;
    auVar101._8_4_ = fVar181 * 0.0 + fVar184 * 0.0 + fVar38 * 0.0 + fVar195 * 0.0;
    auVar101._12_4_ = fVar181 * 0.0 + fVar184 * 0.0 + fVar38 * 0.0 + fVar195 * 0.0;
    auVar131._4_4_ = fVar182;
    auVar131._0_4_ = fVar182;
    auVar131._8_4_ = fVar182;
    auVar131._12_4_ = fVar182;
    auVar14 = vmulps_avx512vl(auVar230,auVar131);
    auVar155._4_4_ = fVar196;
    auVar155._0_4_ = fVar196;
    auVar155._8_4_ = fVar196;
    auVar155._12_4_ = fVar196;
    auVar18 = vmulps_avx512vl(auVar240,auVar155);
    auVar117._4_4_ = fVar183;
    auVar117._0_4_ = fVar183;
    auVar117._8_4_ = fVar183;
    auVar117._12_4_ = fVar183;
    auVar17 = vmulps_avx512vl(auVar248,auVar117);
    auVar170._4_4_ = fVar197;
    auVar170._0_4_ = fVar197;
    auVar170._8_4_ = fVar197;
    auVar170._12_4_ = fVar197;
    auVar22 = vmulps_avx512vl(auVar170,auVar256);
    auVar118._0_4_ = fVar82 * fVar183 + fVar196 * fVar111 + fVar40 * fVar182 + fVar197 * fVar162;
    auVar118._4_4_ = fVar91 * fVar183 + fVar196 * fVar215 + fVar70 * fVar182 + fVar197 * fVar39;
    auVar118._8_4_ = fVar183 * 0.0 + fVar196 * 0.0 + fVar182 * 0.0 + fVar197 * 0.0;
    auVar118._12_4_ = fVar183 * 0.0 + fVar196 * 0.0 + fVar182 * 0.0 + fVar197 * 0.0;
    auVar132._4_4_ = fVar41;
    auVar132._0_4_ = fVar41;
    auVar132._8_4_ = fVar41;
    auVar132._12_4_ = fVar41;
    auVar231._8_8_ = 0;
    auVar231._0_8_ = _viewMat;
    auVar15 = vmulps_avx512vl(auVar231,auVar132);
    auVar171._4_4_ = fVar97;
    auVar171._0_4_ = fVar97;
    auVar171._8_4_ = fVar97;
    auVar171._12_4_ = fVar97;
    auVar241._8_8_ = 0;
    auVar241._0_8_ = DAT_006006b4;
    auVar21 = vmulps_avx512vl(auVar241,auVar171);
    auVar190._4_4_ = fVar109;
    auVar190._0_4_ = fVar109;
    auVar190._8_4_ = fVar109;
    auVar190._12_4_ = fVar109;
    auVar249._8_8_ = 0;
    auVar249._0_8_ = DAT_006006c4;
    auVar16 = vmulps_avx512vl(auVar249,auVar190);
    auVar199._4_4_ = fVar110;
    auVar199._0_4_ = fVar110;
    auVar199._8_4_ = fVar110;
    auVar199._12_4_ = fVar110;
    auVar257._8_8_ = 0;
    auVar257._0_8_ = DAT_006006d4;
    auVar19 = vmulps_avx512vl(auVar199,auVar257);
    auVar133._0_4_ = fVar110 * fVar162 + fVar109 * fVar82 + fVar97 * fVar111 + fVar40 * fVar41;
    auVar133._4_4_ = fVar110 * fVar39 + fVar109 * fVar91 + fVar97 * fVar215 + fVar70 * fVar41;
    auVar133._8_4_ = fVar110 * 0.0 + fVar109 * 0.0 + fVar97 * 0.0 + fVar41 * 0.0;
    auVar133._12_4_ = fVar110 * 0.0 + fVar109 * 0.0 + fVar97 * 0.0 + fVar41 * 0.0;
    auVar25 = ZEXT416(0) << 0x20;
    auVar23 = vmulps_avx512vl(auVar231,auVar25);
    auVar24 = vmulps_avx512vl(auVar241,auVar25);
    auVar25 = vmulps_avx512vl(auVar249,auVar25);
    auVar172._0_4_ = auVar23._0_4_ + auVar24._0_4_ + auVar25._0_4_;
    auVar172._4_4_ = auVar23._4_4_ + auVar24._4_4_ + auVar25._4_4_;
    auVar172._8_4_ = auVar23._8_4_ + auVar24._8_4_ + auVar25._8_4_;
    auVar172._12_4_ = auVar23._12_4_ + auVar24._12_4_ + auVar25._12_4_;
    auVar23 = vaddps_avx512vl(auVar172,auVar257);
    auVar49._0_4_ = fVar40 * 0.0 + fVar111 * 0.0 + fVar82 * 0.0 + fVar162;
    auVar49._4_4_ = fVar70 * 0.0 + fVar215 * 0.0 + fVar91 * 0.0 + fVar39;
    auVar49._8_8_ = 0;
    auVar33 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(auVar22._12_4_ +
                                            auVar17._12_4_ + auVar18._12_4_ + auVar14._12_4_,
                                            CONCAT48(auVar22._8_4_ +
                                                     auVar17._8_4_ + auVar18._8_4_ + auVar14._8_4_,
                                                     CONCAT44(auVar22._4_4_ +
                                                              auVar17._4_4_ +
                                                              auVar18._4_4_ + auVar14._4_4_,
                                                              auVar22._0_4_ +
                                                              auVar17._0_4_ +
                                                              auVar18._0_4_ + auVar14._0_4_)))),
                         auVar118,1);
    vinsertf32x4_avx512f(ZEXT1664(auVar20),auVar101,1);
    auVar29 = vpermt2pd_avx512f(_DAT_0033b6e0,auVar33._0_32_);
    vinsertf32x4_avx512f
              (ZEXT1664(CONCAT412(auVar19._12_4_ + auVar16._12_4_ + auVar15._12_4_ + auVar21._12_4_,
                                  CONCAT48(auVar19._8_4_ +
                                           auVar16._8_4_ + auVar15._8_4_ + auVar21._8_4_,
                                           CONCAT44(auVar19._4_4_ +
                                                    auVar16._4_4_ + auVar15._4_4_ + auVar21._4_4_,
                                                    auVar19._0_4_ +
                                                    auVar16._0_4_ + auVar15._0_4_ + auVar21._0_4_)))
                       ),auVar133,1);
    auVar33 = vinsertf32x4_avx512f(ZEXT1664(auVar23),auVar49,1);
    auVar32 = vpermt2pd_avx512f(auVar32,auVar33);
    goto LAB_001f9701;
  case 3:
    auVar92._8_4_ = 0xbf800000;
    auVar92._0_8_ = 0xbf800000bf800000;
    auVar92._12_4_ = 0xbf800000;
    auVar20 = vmaxps_avx(auVar92,auVar32._0_16_);
    auVar112._8_4_ = 0x3f800000;
    auVar112._0_8_ = 0x3f8000003f800000;
    auVar112._12_4_ = 0x3f800000;
    local_188._0_16_ = vminps_avx(auVar112,auVar20);
    auVar20 = vmovshdup_avx(local_188._0_16_);
    fVar41 = local_188._0_4_;
    auVar74._0_8_ = (double)fVar41;
    auVar74._8_8_ = local_188._8_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = (double)auVar20._0_4_ * (double)auVar20._0_4_;
    auVar20 = vfmadd231sd_fma(auVar22,auVar74,auVar74);
    if (auVar20._0_8_ <= 1.0) {
      dVar42 = 1.0 - auVar20._0_8_;
      if (dVar42 < 0.0) {
        auVar65._0_8_ = sqrt(dVar42);
        auVar65._8_56_ = extraout_var_02;
        auVar20 = auVar65._0_16_;
        auVar112._8_4_ = 0x3f800000;
        auVar112._0_8_ = 0x3f8000003f800000;
        auVar112._12_4_ = 0x3f800000;
        auVar92._8_4_ = 0xbf800000;
        auVar92._0_8_ = 0xbf800000bf800000;
        auVar92._12_4_ = 0xbf800000;
      }
      else {
        auVar46._8_8_ = 0;
        auVar46._0_8_ = dVar42;
        auVar20 = vsqrtsd_avx(auVar46,auVar46);
      }
      auVar50._0_4_ = (float)auVar20._0_8_;
      auVar50._4_12_ = auVar20._4_12_;
      auVar4._8_4_ = 0x80000000;
      auVar4._0_8_ = 0x8000000080000000;
      auVar4._12_4_ = 0x80000000;
      auVar20 = vxorps_avx512vl(auVar50,auVar4);
      fVar41 = auVar20._0_4_;
    }
    else {
      auVar44._0_4_ = fVar41 * fVar41;
      auVar44._4_4_ = local_188._4_4_ * local_188._4_4_;
      auVar44._8_4_ = local_188._8_4_ * local_188._8_4_;
      auVar44._12_4_ = local_188._12_4_ * local_188._12_4_;
      auVar20 = vhaddps_avx(auVar44,auVar44);
      if (auVar20._0_4_ < 0.0) {
        fVar41 = sqrtf(auVar20._0_4_);
        auVar112._8_4_ = 0x3f800000;
        auVar112._0_8_ = 0x3f8000003f800000;
        auVar112._12_4_ = 0x3f800000;
        auVar92._8_4_ = 0xbf800000;
        auVar92._0_8_ = 0xbf800000bf800000;
        auVar92._12_4_ = 0xbf800000;
      }
      else {
        auVar20 = vsqrtss_avx(auVar20,auVar20);
        fVar41 = auVar20._0_4_;
      }
      fVar41 = 1.0 / fVar41;
      auVar86._0_4_ = local_188._0_4_ * fVar41;
      auVar86._4_4_ = local_188._4_4_ * fVar41;
      auVar86._8_4_ = local_188._8_4_ * fVar41;
      auVar86._12_4_ = local_188._12_4_ * fVar41;
      fVar41 = fVar41 * 0.0;
      local_188._0_16_ = auVar86;
    }
    auVar20 = vmaxps_avx(auVar92,auVar33._0_16_);
    auVar93 = vminps_avx(auVar112,auVar20);
    auVar20 = vmovshdup_avx(auVar93);
    fVar38 = auVar93._0_4_;
    auVar75._0_8_ = (double)fVar38;
    auVar75._8_8_ = auVar93._8_8_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = (double)auVar20._0_4_ * (double)auVar20._0_4_;
    auVar20 = vfmadd231sd_fma(auVar51,auVar75,auVar75);
    auVar14 = local_188._0_16_;
    if (auVar20._0_8_ <= 1.0) {
      dVar42 = 1.0 - auVar20._0_8_;
      if (dVar42 < 0.0) {
        auVar66._0_8_ = sqrt(dVar42);
        auVar66._8_56_ = extraout_var_03;
        auVar20 = auVar66._0_16_;
        auVar14 = local_188._0_16_;
      }
      else {
        auVar53._8_8_ = 0;
        auVar53._0_8_ = dVar42;
        auVar20 = vsqrtsd_avx(auVar53,auVar53);
      }
      auVar54._0_4_ = (float)auVar20._0_8_;
      auVar54._4_12_ = auVar20._4_12_;
      auVar3._8_4_ = 0x80000000;
      auVar3._0_8_ = 0x8000000080000000;
      auVar3._12_4_ = 0x80000000;
      _local_198 = vxorps_avx512vl(auVar54,auVar3);
    }
    else {
      auVar52._0_4_ = fVar38 * fVar38;
      fVar184 = auVar93._4_4_;
      auVar52._4_4_ = fVar184 * fVar184;
      fVar181 = auVar93._8_4_;
      auVar52._8_4_ = fVar181 * fVar181;
      fVar195 = auVar93._12_4_;
      auVar52._12_4_ = fVar195 * fVar195;
      auVar20 = vhaddps_avx(auVar52,auVar52);
      if (auVar20._0_4_ < 0.0) {
        fVar182 = sqrtf(auVar20._0_4_);
        auVar14 = local_188._0_16_;
      }
      else {
        auVar20 = vsqrtss_avx(auVar20,auVar20);
        fVar182 = auVar20._0_4_;
      }
      fVar182 = 1.0 / fVar182;
      auVar93._0_4_ = fVar38 * fVar182;
      auVar93._4_4_ = fVar184 * fVar182;
      auVar93._8_4_ = fVar181 * fVar182;
      auVar93._12_4_ = fVar195 * fVar182;
      _local_198 = ZEXT416((uint)(fVar182 * 0.0));
    }
    auVar18 = vmovshdup_avx(auVar14);
    auVar17 = vmovshdup_avx(auVar93);
    auVar20 = vinsertps_avx(ZEXT416((uint)(fVar41 * -auVar17._0_4_)),
                            ZEXT416((uint)(auVar14._0_4_ * -local_198._0_4_)),0x10);
    auVar22 = vfmsub231ss_fma(ZEXT416((uint)(auVar93._0_4_ * auVar18._0_4_)),auVar14,auVar17);
    fVar181 = auVar22._0_4_;
    local_208._0_4_ = -fVar181;
    auVar14 = vmaxss_avx(SUB6416(ZEXT464(0xbf800000),0),
                         ZEXT416((uint)(fVar41 * local_198._0_4_ +
                                       auVar93._0_4_ * auVar14._0_4_ + auVar18._0_4_ * auVar17._0_4_
                                       )));
    auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar14);
    dVar42 = acos((double)auVar14._0_4_ * moveScale);
    local_128._0_4_ = (float)dVar42;
    local_228._0_4_ = cosf((float)dVar42);
    local_228._4_4_ = extraout_XMM0_Db;
    local_228._8_4_ = extraout_XMM0_Dc;
    local_228._12_4_ = extraout_XMM0_Dd;
    auVar67._0_4_ = sinf((float)local_128._0_4_);
    auVar67._4_60_ = extraout_var;
    auVar18 = vpermi2ps_avx512vl(_DAT_0033bdd0,auVar93,local_188._0_16_);
    auVar14 = vinsertps_avx(_local_198,ZEXT416((uint)fVar41),0x10);
    auVar14 = vfmadd213ps_fma(auVar14,auVar18,auVar20);
    auVar76._0_4_ = auVar14._0_4_ * auVar14._0_4_;
    auVar76._4_4_ = auVar14._4_4_ * auVar14._4_4_;
    fVar38 = auVar14._8_4_;
    auVar76._8_4_ = fVar38 * fVar38;
    fVar184 = auVar14._12_4_;
    auVar76._12_4_ = fVar184 * fVar184;
    auVar20 = vhaddps_avx(auVar76,auVar76);
    auVar206._0_8_ = CONCAT44(extraout_var._0_4_,auVar67._0_4_) ^ 0x8000000080000000;
    auVar206._8_4_ = extraout_var._4_4_ ^ 0x80000000;
    auVar206._12_4_ = extraout_var._8_4_ ^ 0x80000000;
    uVar83 = auVar14._0_8_ ^ 0x8000000080000000;
    fVar41 = fVar181 * fVar181 + auVar20._0_4_;
    if (fVar41 < 0.0) {
      local_188._0_16_ = ZEXT416((uint)(1.0 - (float)local_228._0_4_));
      fVar41 = sqrtf(fVar41);
    }
    else {
      auVar20 = vsqrtss_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
      fVar41 = auVar20._0_4_;
      local_188._0_4_ = 1.0 - (float)local_228._0_4_;
    }
    fVar41 = 1.0 / fVar41;
    auVar77._0_4_ = fVar41 * (float)uVar83;
    auVar77._4_4_ = fVar41 * (float)(uVar83 >> 0x20);
    auVar77._8_4_ = fVar41 * -fVar38;
    auVar77._12_4_ = fVar41 * -fVar184;
    fVar41 = fVar41 * (float)local_208._0_4_;
    auVar94._0_4_ = (float)local_188._0_4_ * auVar77._0_4_;
    auVar94._4_4_ = (float)local_188._0_4_ * auVar77._4_4_;
    auVar94._8_4_ = (float)local_188._0_4_ * auVar77._8_4_;
    auVar94._12_4_ = (float)local_188._0_4_ * auVar77._12_4_;
    local_188._0_4_ = (float)local_188._0_4_ * fVar41;
    auVar134._4_4_ = auVar77._0_4_;
    auVar134._0_4_ = auVar77._0_4_;
    auVar134._8_4_ = auVar77._0_4_;
    auVar134._12_4_ = auVar77._0_4_;
    auVar20 = vinsertps_avx(local_228,ZEXT416((uint)((float)auVar206._0_8_ * fVar41)),0x10);
    auVar18 = vfmadd231ps_fma(auVar20,auVar94,auVar134);
    auVar14 = vmovshdup_avx(auVar77);
    auVar20 = vinsertps_avx(ZEXT416((uint)(auVar67._0_4_ * fVar41)),local_228,0x10);
    auVar17 = vfmadd231ps_fma(auVar20,auVar94,auVar14);
    auVar22 = vpermi2ps_avx512vl(_DAT_0033bde0,auVar67._0_16_,auVar206);
    auVar20 = vshufps_avx(auVar77,auVar77,0xe1);
    auVar148._0_4_ = auVar20._0_4_ * auVar22._0_4_;
    auVar148._4_4_ = auVar20._4_4_ * auVar22._4_4_;
    auVar148._8_4_ = auVar20._8_4_ * auVar22._8_4_;
    auVar148._12_4_ = auVar20._12_4_ * auVar22._12_4_;
    auVar156._4_4_ = fVar41;
    auVar156._0_4_ = fVar41;
    auVar156._8_4_ = fVar41;
    auVar156._12_4_ = fVar41;
    auVar20 = vfmadd213ps_fma(auVar156,auVar94,auVar148);
    auVar22 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar14._0_4_)),
                              ZEXT416((uint)local_188._0_4_),auVar77);
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)((float)auVar206._0_8_ * auVar77._0_4_)),
                              ZEXT416((uint)local_188._0_4_),auVar14);
    auVar15 = vfmadd231ss_fma(local_228,ZEXT416((uint)local_188._0_4_),ZEXT416((uint)fVar41));
    fVar41 = auVar17._0_4_ * 0.0;
    fVar38 = auVar17._4_4_ * 0.0;
    fVar184 = auVar17._8_4_ * 0.0;
    fVar181 = auVar17._12_4_ * 0.0;
    local_198._0_4_ = auVar20._0_4_ * 0.0;
    local_198._4_4_ = auVar20._4_4_ * 0.0;
    fStack_190 = auVar20._8_4_ * 0.0;
    fStack_18c = auVar20._12_4_ * 0.0;
    fVar182 = auVar18._0_4_ * 0.0;
    fVar196 = auVar18._4_4_ * 0.0;
    fVar183 = auVar18._8_4_ * 0.0;
    fVar197 = auVar18._12_4_ * 0.0;
    local_108 = fVar182 + fVar41;
    fStack_104 = fVar196 + fVar38;
    fStack_100 = fVar183 + fVar184;
    fStack_fc = fVar197 + fVar181;
    fVar97 = (float)local_198._0_4_ + auVar18._0_4_ + fVar41;
    fVar109 = (float)local_198._4_4_ + auVar18._4_4_ + fVar38;
    fVar110 = fStack_190 + auVar18._8_4_ + fVar184;
    fVar111 = fStack_18c + auVar18._12_4_ + fVar181;
    local_208._0_4_ = auVar20._0_4_ + local_108;
    local_208._4_4_ = auVar20._4_4_ + fStack_104;
    fStack_200 = auVar20._8_4_ + fStack_100;
    fStack_1fc = auVar20._12_4_ + fStack_fc;
    fVar195 = auVar22._0_4_ * 0.0;
    fVar38 = auVar14._0_4_ * 0.0;
    fVar41 = fVar195 + fVar38;
    fVar181 = auVar15._0_4_ * 0.0;
    fVar38 = fVar181 + auVar22._0_4_ + fVar38;
    fVar184 = auVar15._0_4_ + fVar41;
    lVar9 = 0;
    do {
      iVar10 = 0;
      do {
        paVar12 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
                  ((long)&DAT_006006ac + lVar9 * 0x10 + 4);
        if (((iVar10 != 3) &&
            (paVar12 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
                       (&DAT_006006ac + lVar9 * 2), iVar10 != 2)) &&
           (paVar12 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
                      (&viewMat + lVar9 * 4), iVar10 == 1)) {
          paVar12 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *)
                    ((long)&viewMat_4 + lVar9 * 0x10);
        }
        paVar11 = &local_a0 + lVar9 * 4 + 3;
        if (((iVar10 != 3) && (paVar11 = &local_a0 + lVar9 * 4 + 2, iVar10 != 2)) &&
           (paVar11 = &local_a0 + lVar9 * 4, iVar10 == 1)) {
          paVar11 = &local_a0 + lVar9 * 4 + 1;
        }
        *paVar11 = *paVar12;
        iVar10 = iVar10 + 1;
      } while (iVar10 != 3);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    local_108 = (float)local_198._0_4_ + local_108;
    fStack_104 = (float)local_198._4_4_ + fStack_104;
    fStack_100 = fStack_190 + fStack_100;
    fStack_fc = fStack_18c + fStack_fc;
    local_188._0_16_ = ZEXT416((uint)(fVar181 + auVar14._0_4_ + fVar195));
    fVar181 = fVar181 + fVar41;
    fStack_64 = 1.0;
    glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call
              ((mat<4,_4,_float,_(glm::qualifier)0> *)&local_a0);
    auVar149._8_8_ = 0;
    auVar149._0_8_ = local_58;
    auVar224._8_8_ = 0;
    auVar224._0_8_ = local_48;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = local_38;
    auVar264._8_8_ = 0;
    auVar264._0_8_ = local_28;
    auVar14 = vmovshdup_avx512vl(auVar264);
    auVar262._8_8_ = 0;
    auVar262._0_8_ = local_60;
    auVar20 = vmulss_avx512f(ZEXT416((uint)fVar38),auVar262);
    fVar195 = (float)local_58;
    auVar268._8_8_ = 0;
    auVar268._0_8_ = local_50;
    auVar18 = vmulss_avx512f(local_188._0_16_,auVar268);
    fVar215 = (float)local_48;
    auVar266._8_8_ = 0;
    auVar266._0_8_ = local_40;
    auVar22 = vmulss_avx512f(ZEXT416((uint)fVar184),auVar266);
    fVar162 = (float)local_38;
    auVar270._8_8_ = 0;
    auVar270._0_8_ = local_30;
    auVar15 = vmulss_avx512f(ZEXT416((uint)fVar181),auVar270);
    auVar18 = vaddss_avx512f(ZEXT416((uint)(auVar20._0_4_ + auVar18._0_4_ + auVar22._0_4_)),auVar15)
    ;
    auVar20 = vmulss_avx512f(ZEXT416((uint)fVar181),auVar264);
    local_12c = fVar38 * fVar195 + fVar215 * local_188._0_4_ + fVar162 * fVar184 + auVar20._0_4_;
    auVar55._0_12_ = ZEXT812(0);
    auVar55._12_4_ = 0;
    auVar22 = vmulss_avx512f(auVar262,auVar55);
    auVar15 = vmulss_avx512f(auVar268,auVar55);
    auVar21 = vmulss_avx512f(auVar266,auVar55);
    local_130 = fVar195 * 0.0 + fVar215 * 0.0 + fVar162 * 0.0;
    auVar219._0_4_ = (float)local_198._0_4_ + auVar17._0_4_ + fVar182;
    auVar219._4_4_ = (float)local_198._4_4_ + auVar17._4_4_ + fVar196;
    auVar219._8_4_ = fStack_190 + auVar17._8_4_ + fVar183;
    auVar219._12_4_ = fStack_18c + auVar17._12_4_ + fVar197;
    local_c8 = vmovshdup_avx(auVar149);
    local_d8 = vmovshdup_avx(auVar224);
    local_e8 = vmovshdup_avx(auVar173);
    auVar8._4_4_ = fStack_104;
    auVar8._0_4_ = local_108;
    auVar8._8_4_ = fStack_100;
    auVar8._12_4_ = fStack_fc;
    auVar20 = vmulps_avx512vl(auVar8,auVar14);
    auVar216._0_4_ =
         fVar97 * local_c8._0_4_ + auVar219._0_4_ * local_d8._0_4_ +
         (float)local_208._0_4_ * local_e8._0_4_ + auVar20._0_4_;
    auVar216._4_4_ =
         fVar109 * local_c8._4_4_ + auVar219._4_4_ * local_d8._4_4_ +
         (float)local_208._4_4_ * local_e8._4_4_ + auVar20._4_4_;
    auVar216._8_4_ =
         fVar110 * local_c8._8_4_ + auVar219._8_4_ * local_d8._8_4_ + fStack_200 * local_e8._8_4_ +
         auVar20._8_4_;
    auVar216._12_4_ =
         fVar111 * local_c8._12_4_ + auVar219._12_4_ * local_d8._12_4_ +
         fStack_1fc * local_e8._12_4_ + auVar20._12_4_;
    auVar17 = vmulss_avx512f(ZEXT416((uint)local_a0),auVar216);
    auVar20 = vmovshdup_avx(auVar216);
    auVar16 = vmulss_avx512f(ZEXT416(uStack_9c),auVar20);
    local_138 = auVar17._0_4_ + auVar16._0_4_;
    auVar17 = vmulss_avx512f(auVar216,ZEXT416(local_90));
    auVar16 = vmulss_avx512f(auVar20,ZEXT416(uStack_8c));
    local_134 = auVar17._0_4_ + auVar16._0_4_;
    local_13c = auVar216._0_4_ * local_80 + auVar20._0_4_ * local_7c;
    auVar263._8_8_ = 0;
    auVar263._0_8_ = local_60;
    auVar20 = vbroadcastss_avx512vl(auVar263);
    auVar269._8_8_ = 0;
    auVar269._0_8_ = local_50;
    auVar17 = vbroadcastss_avx512vl(auVar269);
    auVar267._8_8_ = 0;
    auVar267._0_8_ = local_40;
    auVar16 = vbroadcastss_avx512vl(auVar267);
    auVar19 = vbroadcastss_avx512vl(auVar270);
    auVar87._0_4_ =
         local_108 * auVar19._0_4_ +
         auVar16._0_4_ * (float)local_208._0_4_ +
         auVar219._0_4_ * auVar17._0_4_ + fVar97 * auVar20._0_4_;
    auVar87._4_4_ =
         fStack_104 * auVar19._4_4_ +
         auVar16._4_4_ * (float)local_208._4_4_ +
         auVar219._4_4_ * auVar17._4_4_ + fVar109 * auVar20._4_4_;
    auVar87._8_4_ =
         fStack_100 * auVar19._8_4_ +
         auVar16._8_4_ * fStack_200 + auVar219._8_4_ * auVar17._8_4_ + fVar110 * auVar20._8_4_;
    auVar87._12_4_ =
         fStack_fc * auVar19._12_4_ +
         auVar16._12_4_ * fStack_1fc + auVar219._12_4_ * auVar17._12_4_ + fVar111 * auVar20._12_4_;
    auVar17 = vmulss_avx512f(ZEXT416((uint)local_a0),auVar87);
    auVar20 = vmovshdup_avx(auVar87);
    auVar16 = vmulss_avx512f(auVar20,ZEXT416(uStack_9c));
    auVar17 = vaddss_avx512f(auVar17,auVar16);
    local_140 = auVar18._0_4_;
    auVar16 = vmulss_avx512f(auVar18,ZEXT416(local_98));
    auVar17 = vaddss_avx512f(auVar17,auVar16);
    auVar271._8_8_ = 0;
    auVar271._0_8_ = local_30;
    auVar22 = vaddss_avx512f(ZEXT416((uint)(auVar22._0_4_ + auVar15._0_4_ + auVar21._0_4_)),auVar271
                            );
    auVar15 = vmulss_avx512f(auVar22,ZEXT416(uStack_94));
    _local_198 = vaddss_avx512f(auVar17,auVar15);
    auVar17 = vmulss_avx512f(auVar87,ZEXT416(local_90));
    auVar15 = vmulss_avx512f(auVar20,ZEXT416(uStack_8c));
    auVar17 = vaddss_avx512f(auVar17,auVar15);
    auVar15 = vmulss_avx512f(auVar18,ZEXT416(local_88));
    auVar17 = vaddss_avx512f(auVar17,auVar15);
    auVar15 = vmulss_avx512f(auVar22,ZEXT416(uStack_84));
    auVar17 = vaddss_avx512f(auVar17,auVar15);
    auVar18 = vmulss_avx512f(auVar18,ZEXT416(local_78));
    auVar15 = vmulss_avx512f(auVar22,ZEXT416(uStack_74));
    fVar41 = auVar87._0_4_ * local_80 + auVar20._0_4_ * local_7c + auVar18._0_4_ + auVar15._0_4_;
    local_128 = ZEXT416((uint)fVar41);
    auVar18 = vmovshdup_avx512vl(auVar263);
    auVar15 = vmovshdup_avx512vl(auVar269);
    auVar207._0_4_ = auVar18._0_4_ * fVar97;
    auVar207._4_4_ = auVar18._4_4_ * fVar109;
    auVar207._8_4_ = auVar18._8_4_ * fVar110;
    auVar207._12_4_ = auVar18._12_4_ * fVar111;
    auVar20 = vmulps_avx512vl(auVar219,auVar15);
    auVar20 = vaddps_avx512vl(auVar207,auVar20);
    auVar21 = vmovshdup_avx512vl(auVar267);
    auVar16 = vmulps_avx512vl(_local_208,auVar21);
    auVar20 = vaddps_avx512vl(auVar20,auVar16);
    auVar14 = vmulss_avx512f(ZEXT416((uint)fVar181),auVar14);
    auVar16 = vmovshdup_avx512vl(auVar271);
    local_f8 = vmulss_avx512f(ZEXT416((uint)fVar181),auVar16);
    auVar16 = vmulps_avx512vl(auVar8,auVar16);
    auVar16 = vaddps_avx512vl(auVar20,auVar16);
    auVar19 = vmulss_avx512f(ZEXT416((uint)local_a0),auVar16);
    auVar20 = vmovshdup_avx(auVar16);
    auVar23 = vmulss_avx512f(auVar20,ZEXT416(uStack_9c));
    auVar19 = vaddss_avx512f(auVar19,auVar23);
    local_144 = auVar19._0_4_;
    auVar19 = vmulss_avx512f(auVar16,ZEXT416(local_90));
    auVar23 = vmulss_avx512f(auVar20,ZEXT416(uStack_8c));
    auVar19 = vaddss_avx512f(auVar19,auVar23);
    auVar23 = vmulss_avx512f(auVar16,ZEXT416((uint)local_80));
    auVar23 = vaddss_avx512f(auVar23,ZEXT416((uint)(auVar20._0_4_ * local_7c)));
    auVar265._8_8_ = 0;
    auVar265._0_8_ = local_28;
    auVar20 = vbroadcastss_avx512vl(auVar265);
    auVar56._0_4_ =
         local_108 * auVar20._0_4_ +
         fVar97 * fVar195 + auVar219._0_4_ * fVar215 + (float)local_208._0_4_ * fVar162;
    auVar56._4_4_ =
         fStack_104 * auVar20._4_4_ +
         fVar109 * fVar195 + auVar219._4_4_ * fVar215 + (float)local_208._4_4_ * fVar162;
    auVar56._8_4_ =
         fStack_100 * auVar20._8_4_ +
         fVar110 * fVar195 + auVar219._8_4_ * fVar215 + fStack_200 * fVar162;
    auVar56._12_4_ =
         fStack_fc * auVar20._12_4_ +
         fVar111 * fVar195 + auVar219._12_4_ * fVar215 + fStack_1fc * fVar162;
    auVar24 = vmulss_avx512f(ZEXT416((uint)local_a0),auVar56);
    auVar20 = vmovshdup_avx(auVar56);
    auVar25 = vmulss_avx512f(ZEXT416(uStack_9c),auVar20);
    auVar26 = vmulss_avx512f(ZEXT416((uint)local_12c),ZEXT416(local_98));
    auVar27 = vaddss_avx512f(auVar265,ZEXT416((uint)local_130));
    auVar28 = vmulss_avx512f(auVar27,ZEXT416(uStack_94));
    auVar24 = vaddss_avx512f(auVar28,ZEXT416((uint)(auVar26._0_4_ + auVar25._0_4_ + auVar24._0_4_)))
    ;
    auVar25 = vmulss_avx512f(auVar56,ZEXT416(local_90));
    auVar26 = vmulss_avx512f(auVar20,ZEXT416(uStack_8c));
    auVar28 = vmulss_avx512f(ZEXT416((uint)local_12c),ZEXT416(local_88));
    auVar13 = vmulss_avx512f(auVar27,ZEXT416(uStack_84));
    auVar25 = vaddss_avx512f(ZEXT416((uint)(auVar28._0_4_ + auVar26._0_4_ + auVar25._0_4_)),auVar13)
    ;
    auVar26 = vmulss_avx512f(ZEXT416((uint)local_12c),ZEXT416(local_78));
    auVar28 = vmulss_avx512f(auVar27,ZEXT416(uStack_74));
    auVar26 = vaddss_avx512f(ZEXT416((uint)(auVar56._0_4_ * local_80 + auVar20._0_4_ * local_7c +
                                           auVar26._0_4_)),auVar28);
    fVar181 = (float)local_70;
    auVar88._0_4_ = auVar87._0_4_ * fVar181;
    fVar195 = (float)((ulong)local_70 >> 0x20);
    auVar88._4_4_ = auVar87._4_4_ * fVar195;
    auVar88._8_4_ = auVar87._8_4_ * 0.0;
    auVar88._12_4_ = auVar87._12_4_ * 0.0;
    auVar150._0_4_ = auVar16._0_4_ * fVar181;
    auVar150._4_4_ = auVar16._4_4_ * fVar195;
    auVar150._8_4_ = auVar16._8_4_ * 0.0;
    auVar150._12_4_ = auVar16._12_4_ * 0.0;
    auVar57._0_4_ = auVar56._0_4_ * fVar181;
    auVar57._4_4_ = auVar56._4_4_ * fVar195;
    auVar57._8_4_ = auVar56._8_4_ * 0.0;
    auVar57._12_4_ = auVar56._12_4_ * 0.0;
    auVar135._0_4_ = auVar216._0_4_ * fVar181;
    auVar135._4_4_ = auVar216._4_4_ * fVar195;
    auVar135._8_4_ = auVar216._8_4_ * 0.0;
    auVar135._12_4_ = auVar216._12_4_ * 0.0;
    auVar31._16_48_ = auVar35;
    auVar31._0_16_ = ZEXT816(0);
    auVar30._4_60_ = auVar31._4_60_;
    auVar30._0_4_ = local_188._0_4_;
    auVar20 = vmulps_avx512vl(auVar30._0_16_,local_d8);
    auVar102._0_4_ =
         fVar38 * local_c8._0_4_ + auVar20._0_4_ + fVar184 * local_e8._0_4_ + auVar14._0_4_;
    auVar102._4_4_ =
         local_c8._4_4_ * 0.0 + auVar20._4_4_ + local_e8._4_4_ * 0.0 + (float)(local_28 >> 0x20);
    auVar102._8_4_ = local_c8._8_4_ * 0.0 + auVar20._8_4_ + local_e8._8_4_ * 0.0 + 0.0;
    auVar102._12_4_ = local_c8._12_4_ * 0.0 + auVar20._12_4_ + local_e8._12_4_ * 0.0 + 0.0;
    auVar20 = vmulss_avx512f(auVar102,ZEXT416(local_98));
    auVar14 = vmovshdup_avx(auVar102);
    auVar16 = vmulss_avx512f(auVar14,ZEXT416(uStack_94));
    fVar181 = auVar16._0_4_ + auVar20._0_4_ + local_138;
    auVar20 = vmulss_avx512f(auVar102,ZEXT416(local_88));
    auVar16 = vmulss_avx512f(auVar14,ZEXT416(uStack_84));
    fVar195 = auVar16._0_4_ + auVar20._0_4_ + local_134;
    auVar16 = vmulss_avx512f(auVar102,ZEXT416(local_78));
    auVar20 = vhaddps_avx(auVar88,auVar88);
    auVar28 = vmulss_avx512f(auVar14,ZEXT416(uStack_74));
    auVar14 = vhaddps_avx(auVar57,auVar57);
    auVar208._4_4_ = fStack_64;
    auVar208._0_4_ = local_68;
    auVar208._8_8_ = 0;
    auVar13 = vaddss_avx512f(auVar20,ZEXT416((uint)(local_68 * local_140)));
    auVar20 = vmulps_avx512vl(auVar30._0_16_,auVar15);
    auVar15 = vmulps_avx512vl(ZEXT416((uint)fVar184),auVar21);
    auVar95._0_4_ = auVar18._0_4_ * fVar38 + auVar20._0_4_ + auVar15._0_4_ + (float)local_f8._0_4_;
    auVar95._4_4_ = auVar18._4_4_ * 0.0 + auVar20._4_4_ + auVar15._4_4_ + (float)(local_30 >> 0x20);
    auVar95._8_4_ = auVar18._8_4_ * 0.0 + auVar20._8_4_ + auVar15._8_4_ + 0.0;
    auVar95._12_4_ = auVar18._12_4_ * 0.0 + auVar20._12_4_ + auVar15._12_4_ + 0.0;
    auVar18 = vmulss_avx512f(auVar95,ZEXT416(local_98));
    auVar20 = vmovshdup_avx(auVar95);
    auVar15 = vmulss_avx512f(auVar20,ZEXT416(uStack_94));
    fVar38 = auVar18._0_4_ + local_144 + auVar15._0_4_;
    auVar18 = vmulss_avx512f(auVar95,ZEXT416(local_88));
    auVar18 = vaddss_avx512f(auVar19,auVar18);
    auVar78._0_4_ = local_68 * auVar102._0_4_;
    auVar78._4_4_ = fStack_64 * auVar102._4_4_;
    auVar78._8_4_ = auVar102._8_4_ * 0.0;
    auVar78._12_4_ = auVar102._12_4_ * 0.0;
    auVar15 = vmulss_avx512f(auVar20,ZEXT416(uStack_84));
    fVar184 = auVar18._0_4_ + auVar15._0_4_;
    auVar18 = vmovshdup_avx(auVar208);
    auVar15 = vmulss_avx512f(auVar95,ZEXT416(local_78));
    auVar20 = vmulss_avx512f(auVar20,ZEXT416(uStack_74));
    fVar182 = auVar15._0_4_ + auVar23._0_4_ + auVar20._0_4_;
    auVar225._0_4_ = local_68 * auVar95._0_4_;
    auVar225._4_4_ = fStack_64 * auVar95._4_4_;
    auVar225._8_4_ = auVar95._8_4_ * 0.0;
    auVar225._12_4_ = auVar95._12_4_ * 0.0;
    auVar20 = vmulss_avx512f(auVar27,auVar18);
    auVar18 = vaddss_avx512f(auVar13,ZEXT416((uint)(auVar22._0_4_ * auVar18._0_4_)));
    fVar196 = auVar14._0_4_ + local_12c * local_68 + auVar20._0_4_;
    auVar191._8_8_ = 0;
    auVar191._0_8_ = _viewMat;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = DAT_006006ac;
    auVar209._8_8_ = 0;
    auVar209._0_8_ = DAT_006006b4;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = DAT_006006c4;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = DAT_006006d4;
    auVar20 = vbroadcastss_avx512vl(ZEXT416((uint)fVar41));
    auVar14 = vmulps_avx512vl(auVar20,auVar191);
    auVar220._4_4_ = fVar182;
    auVar220._0_4_ = fVar182;
    auVar220._8_4_ = fVar182;
    auVar220._12_4_ = fVar182;
    auVar22 = vmulps_avx512vl(auVar220,auVar209);
    auVar14 = vaddps_avx512vl(auVar14,auVar22);
    auVar22 = vbroadcastss_avx512vl(auVar26);
    auVar15 = vmulps_avx512vl(auVar22,auVar103);
    auVar14 = vaddps_avx512vl(auVar14,auVar15);
    auVar15 = vbroadcastss_avx512vl(ZEXT416((uint)(auVar16._0_4_ + local_13c + auVar28._0_4_)));
    auVar21 = vmulps_avx512vl(auVar15,auVar96);
    auVar21 = vaddps_avx512vl(auVar14,auVar21);
    auVar20 = vmulps_avx512vl(auVar20,auVar58);
    fVar183 = viewMat._24_4_;
    auVar221._0_4_ = fVar182 * fVar183;
    fVar109 = viewMat._28_4_;
    auVar221._4_4_ = fVar182 * fVar109;
    auVar221._8_4_ = fVar182 * 0.0;
    auVar221._12_4_ = fVar182 * 0.0;
    auVar20 = vaddps_avx512vl(auVar20,auVar221);
    auVar222._8_8_ = 0;
    auVar222._0_8_ = DAT_006006cc;
    auVar14 = vmulps_avx512vl(auVar22,auVar222);
    auVar20 = vaddps_avx512vl(auVar20,auVar14);
    auVar232._8_8_ = 0;
    auVar232._0_8_ = DAT_006006dc;
    auVar14 = vmulps_avx512vl(auVar15,auVar232);
    auVar22 = vaddps_avx512vl(auVar20,auVar14);
    auVar18 = vbroadcastss_avx512vl(auVar18);
    auVar20 = vhaddps_avx(auVar150,auVar150);
    auVar15 = vmulps_avx512vl(auVar18,auVar191);
    auVar14 = vmovshdup_avx(auVar225);
    fVar41 = auVar14._0_4_ + auVar225._0_4_ + auVar20._0_4_;
    fVar162 = viewMat._16_4_;
    auVar226._0_4_ = fVar162 * fVar41;
    fVar215 = viewMat._20_4_;
    auVar226._4_4_ = fVar215 * fVar41;
    auVar226._8_4_ = fVar41 * 0.0;
    auVar226._12_4_ = fVar41 * 0.0;
    auVar14 = vaddps_avx512vl(auVar15,auVar226);
    auVar157._4_4_ = fVar196;
    auVar157._0_4_ = fVar196;
    auVar157._8_4_ = fVar196;
    auVar157._12_4_ = fVar196;
    auVar15 = vmulps_avx512vl(auVar157,auVar103);
    auVar20 = vhaddps_avx(auVar135,auVar135);
    auVar15 = vaddps_avx512vl(auVar14,auVar15);
    auVar14 = vmovshdup_avx(auVar78);
    fVar182 = auVar20._0_4_ + auVar78._0_4_ + auVar14._0_4_;
    auVar79._4_4_ = fVar182;
    auVar79._0_4_ = fVar182;
    auVar79._8_4_ = fVar182;
    auVar79._12_4_ = fVar182;
    fVar197 = viewMat._48_4_;
    fVar110 = viewMat._52_4_;
    auVar20 = vmulps_avx512vl(auVar18,auVar58);
    fVar97 = viewMat._40_4_;
    fVar111 = viewMat._44_4_;
    auVar14 = vmulps_avx512vl(auVar79,auVar232);
    auVar80._0_4_ = fVar196 * fVar97 + auVar20._0_4_ + fVar183 * fVar41 + auVar14._0_4_;
    auVar80._4_4_ = fVar196 * fVar111 + auVar20._4_4_ + fVar109 * fVar41 + auVar14._4_4_;
    auVar80._8_4_ = fVar196 * 0.0 + auVar20._8_4_ + fVar41 * 0.0 + auVar14._8_4_;
    auVar80._12_4_ = fVar196 * 0.0 + auVar20._12_4_ + fVar41 * 0.0 + auVar14._12_4_;
    auVar32 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(auVar15._12_4_ + fVar182 * 0.0,
                                            CONCAT48(auVar15._8_4_ + fVar182 * 0.0,
                                                     CONCAT44(auVar15._4_4_ + fVar182 * fVar110,
                                                              auVar15._0_4_ + fVar182 * fVar197)))),
                         auVar80,1);
    auVar33 = vinsertf32x4_avx512f(ZEXT1664(auVar21),auVar22,1);
    auVar34 = vbroadcasti64x4_avx512f(_DAT_0033b6c0);
    auVar32 = vpermi2pd_avx512f(auVar34,auVar33,auVar32);
    auVar20 = vbroadcastss_avx512vl(auVar24);
    auVar174._4_4_ = fVar181;
    auVar174._0_4_ = fVar181;
    auVar174._8_4_ = fVar181;
    auVar174._12_4_ = fVar181;
    auVar233._8_8_ = 0;
    auVar233._0_8_ = DAT_006006dc;
    auVar14 = vmulps_avx512vl(auVar174,auVar233);
    auVar136._0_4_ =
         (float)local_198._0_4_ * viewMat._8_4_ + fVar183 * fVar38 + auVar20._0_4_ * fVar97 +
         auVar14._0_4_;
    auVar136._4_4_ =
         (float)local_198._0_4_ * viewMat._12_4_ + fVar109 * fVar38 + auVar20._4_4_ * fVar111 +
         auVar14._4_4_;
    auVar136._8_4_ =
         (float)local_198._0_4_ * 0.0 + fVar38 * 0.0 + auVar20._8_4_ * 0.0 + auVar14._8_4_;
    auVar136._12_4_ =
         (float)local_198._0_4_ * 0.0 + fVar38 * 0.0 + auVar20._12_4_ * 0.0 + auVar14._12_4_;
    local_1f8 = auVar17._0_4_;
    auVar14 = vbroadcastss_avx512vl(auVar25);
    auVar119._4_4_ = fVar195;
    auVar119._0_4_ = fVar195;
    auVar119._8_4_ = fVar195;
    auVar119._12_4_ = fVar195;
    auVar18 = vmulps_avx512vl(auVar119,auVar233);
    auVar59._0_4_ =
         local_1f8 * viewMat._8_4_ + fVar183 * fVar184 + auVar14._0_4_ * fVar97 + auVar18._0_4_;
    auVar59._4_4_ =
         local_1f8 * viewMat._12_4_ + fVar109 * fVar184 + auVar14._4_4_ * fVar111 + auVar18._4_4_;
    auVar59._8_4_ = local_1f8 * 0.0 + fVar184 * 0.0 + auVar14._8_4_ * 0.0 + auVar18._8_4_;
    auVar59._12_4_ = local_1f8 * 0.0 + fVar184 * 0.0 + auVar14._12_4_ * 0.0 + auVar18._12_4_;
    auVar33 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(local_1f8 * 0.0 + fVar184 * 0.0 + auVar14._12_4_ * 0.0 +
                                            fVar195 * 0.0,
                                            CONCAT48(local_1f8 * 0.0 + fVar184 * 0.0 +
                                                     auVar14._8_4_ * 0.0 + fVar195 * 0.0,
                                                     CONCAT44(viewMat._4_4_ * local_1f8 +
                                                              fVar215 * fVar184 +
                                                              auVar14._4_4_ * viewMat._36_4_ +
                                                              fVar195 * fVar110,
                                                              viewMat * local_1f8 +
                                                              fVar162 * fVar184 +
                                                              auVar14._0_4_ * viewMat._32_4_ +
                                                              fVar195 * fVar197)))),auVar59,1);
    auVar34 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(fVar181 * 0.0 +
                                            auVar20._12_4_ * 0.0 +
                                            fVar38 * 0.0 + (float)local_198._0_4_ * 0.0,
                                            CONCAT48(fVar181 * 0.0 +
                                                     auVar20._8_4_ * 0.0 +
                                                     fVar38 * 0.0 + (float)local_198._0_4_ * 0.0,
                                                     CONCAT44(fVar181 * fVar110 +
                                                              auVar20._4_4_ * viewMat._36_4_ +
                                                              fVar215 * fVar38 +
                                                              viewMat._4_4_ * (float)local_198._0_4_
                                                              ,fVar181 * fVar197 +
                                                               auVar20._0_4_ * viewMat._32_4_ +
                                                               fVar162 * fVar38 +
                                                               viewMat * (float)local_198._0_4_)))),
                         auVar136,1);
    auVar29 = vpermi2pd_avx512vl(_DAT_0033b6e0,auVar34._0_32_,auVar33._0_32_);
    _viewMat = vinsertf64x4_avx512f(auVar32,auVar29,0);
    break;
  case 5:
    fVar38 = (float)(((double)(aVar72.x - aVar36.x) + (double)(aVar72.x - aVar36.x)) * moveScale);
    dVar42 = ((double)(fVar41 - (float)local_188._0_4_) + (double)(fVar41 - (float)local_188._0_4_))
             * moveScale;
    auVar20 = ZEXT816(0) << 0x40;
    local_228._8_8_ = 0;
    local_228._0_8_ = _viewMat;
    _fStack_200 = 0;
    local_208 = (undefined1  [8])DAT_006006c4;
    switch(upDir) {
    case 0:
      _local_198 = SUB6416(ZEXT464(0x3f800000),0);
      break;
    case 1:
      _local_198 = ZEXT816(0x3f80000000000000);
      break;
    case 2:
      _local_198 = SUB6416(ZEXT864(0),0) << 0x20;
      auVar20 = SUB6416(ZEXT464(0x3f800000),0);
      break;
    case 3:
      _local_198 = SUB6416(ZEXT464(0xbf800000),0);
      break;
    case 4:
      _local_198 = ZEXT816(0xbf80000000000000);
      break;
    case 5:
      _local_198 = SUB6416(ZEXT864(0),0) << 0x20;
      auVar20 = SUB6416(ZEXT464(0xbf800000),0);
      break;
    default:
      _local_198 = SUB6416(ZEXT864(0),0) << 0x20;
    }
    local_188._4_4_ = (int)((ulong)dVar42 >> 0x20);
    local_188._0_4_ = (float)dVar42;
    local_188._8_8_ = 0;
    auVar14 = vmovshdup_avx(_local_198);
    local_218._4_4_ = viewMat._20_4_ * auVar14._4_4_;
    local_218._0_4_ = viewMat._16_4_ * auVar14._0_4_;
    fStack_210 = auVar14._8_4_ * 0.0;
    fStack_20c = auVar14._12_4_ * 0.0;
    auVar14 = vfmadd213ss_fma(ZEXT416((uint)(float)DAT_006006ac),_local_198,
                              ZEXT416((uint)(DAT_006006bc * auVar14._0_4_)));
    auVar14 = vfmadd213ss_fma(ZEXT416((uint)DAT_006006cc),auVar20,auVar14);
    fVar196 = auVar14._0_4_;
    local_128._0_4_ = fVar38;
    local_1e8._0_4_ = cosf(fVar38);
    local_1e8._4_4_ = extraout_XMM0_Db_00;
    local_1e8._8_4_ = extraout_XMM0_Dc_00;
    local_1e8._12_4_ = extraout_XMM0_Dd_00;
    auVar34._0_4_ = sinf((float)local_128._0_4_);
    auVar34._4_60_ = extraout_var_00;
    auVar18._4_4_ = local_198._0_4_;
    auVar18._0_4_ = local_198._0_4_;
    auVar18._8_4_ = local_198._0_4_;
    auVar18._12_4_ = local_198._0_4_;
    auVar14 = vfmadd132ps_fma(auVar18,_local_218,local_228);
    local_1f8 = auVar20._0_4_;
    auVar20._4_4_ = local_1f8;
    auVar20._0_4_ = local_1f8;
    auVar20._8_4_ = local_1f8;
    auVar20._12_4_ = local_1f8;
    auVar20 = vfmadd132ps_fma(auVar20,auVar14,_local_208);
    fVar38 = auVar20._0_4_;
    auVar15._0_4_ = fVar38 * fVar38;
    fVar184 = auVar20._4_4_;
    auVar15._4_4_ = fVar184 * fVar184;
    fVar181 = auVar20._8_4_;
    auVar15._8_4_ = fVar181 * fVar181;
    fVar195 = auVar20._12_4_;
    auVar15._12_4_ = fVar195 * fVar195;
    auVar20 = vhaddps_avx(auVar15,auVar15);
    fVar182 = 1.0 - (float)local_1e8._0_4_;
    auVar14._8_4_ = 0x80000000;
    auVar14._0_8_ = 0x8000000080000000;
    auVar14._12_4_ = 0x80000000;
    auVar14 = vxorps_avx512vl(auVar34._0_16_,auVar14);
    fVar41 = fVar196 * fVar196 + auVar20._0_4_;
    if (fVar41 < 0.0) {
      fVar41 = sqrtf(fVar41);
    }
    else {
      auVar20 = vsqrtss_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
      fVar41 = auVar20._0_4_;
    }
    fVar41 = 1.0 / fVar41;
    auVar16._0_4_ = fVar41 * fVar38;
    auVar16._4_4_ = fVar41 * fVar184;
    auVar16._8_4_ = fVar41 * fVar181;
    auVar16._12_4_ = fVar41 * fVar195;
    fVar41 = fVar41 * fVar196;
    auVar24._0_4_ = fVar182 * auVar16._0_4_;
    auVar24._4_4_ = fVar182 * auVar16._4_4_;
    auVar24._8_4_ = fVar182 * auVar16._8_4_;
    auVar24._12_4_ = fVar182 * auVar16._12_4_;
    fVar182 = fVar182 * fVar41;
    auVar28._4_4_ = fVar41;
    auVar28._0_4_ = fVar41;
    auVar28._8_4_ = fVar41;
    auVar28._12_4_ = fVar41;
    auVar20 = vinsertps_avx(auVar34._0_16_,auVar14,0x10);
    auVar141._0_4_ = fVar41 * auVar20._0_4_;
    auVar141._4_4_ = fVar41 * auVar20._4_4_;
    auVar141._8_4_ = fVar41 * auVar20._8_4_;
    auVar141._12_4_ = fVar41 * auVar20._12_4_;
    auVar14 = vshufps_avx(auVar16,auVar16,0xe1);
    auVar18 = vfmadd231ps_fma(auVar141,auVar24,auVar14);
    auVar15 = vbroadcastss_avx512vl(local_1e8);
    auVar15 = vfmadd231ps_fma(auVar15,auVar24,auVar16);
    auVar20 = vshufps_avx(auVar20,auVar20,0xe1);
    auVar122._0_4_ = auVar20._0_4_ * auVar14._0_4_;
    auVar122._4_4_ = auVar20._4_4_ * auVar14._4_4_;
    auVar122._8_4_ = auVar20._8_4_ * auVar14._8_4_;
    auVar122._12_4_ = auVar20._12_4_ * auVar14._12_4_;
    auVar21 = vfmadd231ps_fma(auVar122,auVar24,auVar28);
    auVar19._0_4_ = auVar20._0_4_ * auVar16._0_4_;
    auVar19._4_4_ = auVar20._4_4_ * auVar16._4_4_;
    auVar19._8_4_ = auVar20._8_4_ * auVar16._8_4_;
    auVar19._12_4_ = auVar20._12_4_ * auVar16._12_4_;
    auVar13._4_4_ = fVar182;
    auVar13._0_4_ = fVar182;
    auVar13._8_4_ = fVar182;
    auVar13._12_4_ = fVar182;
    auVar14 = vfmadd213ps_fma(auVar13,auVar14,auVar19);
    auVar16 = vfmadd231ss_avx512f(local_1e8,ZEXT416((uint)fVar182),ZEXT416((uint)fVar41));
    fVar38 = auVar18._0_4_ * 0.0;
    fVar181 = auVar18._4_4_ * 0.0;
    fVar182 = auVar18._8_4_ * 0.0;
    fVar183 = auVar18._12_4_ * 0.0;
    fVar184 = auVar15._0_4_ * 0.0;
    fVar195 = auVar15._4_4_ * 0.0;
    fVar196 = auVar15._8_4_ * 0.0;
    fVar197 = auVar15._12_4_ * 0.0;
    auVar201._0_4_ = auVar21._0_4_ * 0.0;
    auVar201._4_4_ = auVar21._4_4_ * 0.0;
    auVar201._8_4_ = auVar21._8_4_ * 0.0;
    auVar201._12_4_ = auVar21._12_4_ * 0.0;
    auVar25._0_4_ = auVar201._0_4_ + fVar184 + auVar18._0_4_;
    auVar25._4_4_ = auVar201._4_4_ + fVar195 + auVar18._4_4_;
    auVar25._8_4_ = auVar201._8_4_ + fVar196 + auVar18._8_4_;
    auVar25._12_4_ = auVar201._12_4_ + fVar197 + auVar18._12_4_;
    auVar26._0_4_ = auVar201._0_4_ + auVar15._0_4_ + fVar38;
    auVar26._4_4_ = auVar201._4_4_ + auVar15._4_4_ + fVar181;
    auVar26._8_4_ = auVar201._8_4_ + auVar15._8_4_ + fVar182;
    auVar26._12_4_ = auVar201._12_4_ + auVar15._12_4_ + fVar183;
    auVar142._0_4_ = auVar14._0_4_ * 0.0;
    auVar142._4_4_ = auVar14._4_4_ * 0.0;
    auVar142._8_4_ = auVar14._8_4_ * 0.0;
    auVar142._12_4_ = auVar14._12_4_ * 0.0;
    auVar20 = vshufps_avx(auVar142,auVar142,0xe1);
    auVar17 = vxorps_avx512vl(auVar17,auVar17);
    auVar18 = vmulss_avx512f(auVar16,auVar17);
    fVar41 = auVar18._0_4_;
    auVar210._4_4_ = fVar41;
    auVar210._0_4_ = fVar41;
    auVar210._8_4_ = fVar41;
    auVar210._12_4_ = fVar41;
    auVar23._0_4_ = fVar41 + auVar14._0_4_ + auVar20._0_4_;
    auVar23._4_4_ = fVar41 + auVar14._4_4_ + auVar20._4_4_;
    auVar23._8_4_ = fVar41 + auVar14._8_4_ + auVar20._8_4_;
    auVar23._12_4_ = fVar41 + auVar14._12_4_ + auVar20._12_4_;
    auVar18 = vmulss_avx512f(ZEXT416((uint)DAT_006006ac._4_4_),auVar17);
    auVar15 = vmulss_avx512f(ZEXT416(_DAT_006006c0),auVar17);
    auVar19 = vmulss_avx512f(ZEXT416(DAT_006006cc._4_4_),auVar17);
    fVar184 = fVar184 + fVar38;
    fVar195 = fVar195 + fVar181;
    fVar196 = fVar196 + fVar182;
    fVar197 = fVar197 + fVar183;
    auVar20 = vblendps_avx(auVar201,auVar21,2);
    auVar160._0_4_ = auVar20._0_4_ + fVar184;
    auVar160._4_4_ = auVar20._4_4_ + fVar195;
    auVar160._8_4_ = auVar20._8_4_ + fVar196;
    auVar160._12_4_ = auVar20._12_4_ + fVar197;
    auVar20 = vblendps_avx(auVar21,auVar201,2);
    fVar184 = fVar184 + auVar20._0_4_;
    fVar195 = fVar195 + auVar20._4_4_;
    fVar196 = fVar196 + auVar20._8_4_;
    fVar197 = fVar197 + auVar20._12_4_;
    auVar14 = vinsertps_avx512f(auVar210,auVar16,0x10);
    auVar20 = vhaddps_avx(auVar142,auVar142);
    fVar41 = auVar20._0_4_;
    auVar123._0_4_ = auVar14._0_4_ + fVar41;
    auVar123._4_4_ = auVar14._4_4_ + fVar41;
    auVar123._8_4_ = auVar14._8_4_ + fVar41;
    auVar123._12_4_ = auVar14._12_4_ + fVar41;
    auVar202._8_8_ = 0;
    auVar202._0_8_ = DAT_006006c4;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = _viewMat;
    auVar211._4_4_ = (float)DAT_006006ac;
    auVar211._0_4_ = (float)DAT_006006ac;
    auVar211._8_4_ = (float)DAT_006006ac;
    auVar211._12_4_ = (float)DAT_006006ac;
    auVar14 = vshufps_avx512vl(auVar23,auVar23,0xe1);
    auVar20 = vmulps_avx512vl(auVar211,auVar14);
    auVar21 = vmulps_avx512vl(auVar178,auVar25);
    auVar21 = vshufps_avx512vl(auVar21,auVar21,0xe1);
    auVar16 = vmulps_avx512vl(auVar178,auVar26);
    auVar21 = vaddps_avx512vl(auVar21,auVar16);
    auVar20 = vaddps_avx512vl(auVar20,auVar21);
    auVar227._0_4_ = auVar18._0_4_;
    auVar227._4_4_ = auVar227._0_4_;
    auVar227._8_4_ = auVar227._0_4_;
    auVar227._12_4_ = auVar227._0_4_;
    auVar143._0_4_ = auVar227._0_4_ + auVar20._0_4_;
    auVar143._4_4_ = auVar227._0_4_ + auVar20._4_4_;
    auVar143._8_4_ = auVar227._0_4_ + auVar20._8_4_;
    auVar143._12_4_ = auVar227._0_4_ + auVar20._12_4_;
    auVar20 = vmulps_avx512vl(auVar178,auVar160);
    auVar20 = vshufps_avx512vl(auVar20,auVar20,0xe1);
    auVar179._0_4_ = viewMat * fVar184;
    auVar179._4_4_ = viewMat._4_4_ * fVar195;
    auVar179._8_4_ = fVar196 * 0.0;
    auVar179._12_4_ = fVar197 * 0.0;
    auVar18 = vaddps_avx512vl(auVar20,auVar179);
    auVar21 = vshufps_avx512vl(auVar123,auVar123,0xe1);
    auVar16 = vmulps_avx512vl(auVar211,auVar21);
    auVar20 = vinsertps_avx(auVar227,ZEXT416((uint)DAT_006006ac._4_4_),0x10);
    auVar180._0_4_ = auVar20._0_4_ + auVar16._0_4_ + auVar18._0_4_;
    auVar180._4_4_ = auVar20._4_4_ + auVar16._4_4_ + auVar18._4_4_;
    auVar180._8_4_ = auVar20._8_4_ + auVar16._8_4_ + auVar18._8_4_;
    auVar180._12_4_ = auVar20._12_4_ + auVar16._12_4_ + auVar18._12_4_;
    auVar212._8_8_ = 0;
    auVar212._0_8_ = DAT_006006b4;
    auVar217._4_4_ = DAT_006006bc;
    auVar217._0_4_ = DAT_006006bc;
    auVar217._8_4_ = DAT_006006bc;
    auVar217._12_4_ = DAT_006006bc;
    auVar20 = vmulps_avx512vl(auVar14,auVar217);
    auVar18 = vmulps_avx512vl(auVar212,auVar25);
    auVar18 = vshufps_avx512vl(auVar18,auVar18,0xe1);
    auVar16 = vmulps_avx512vl(auVar212,auVar26);
    auVar18 = vaddps_avx512vl(auVar18,auVar16);
    auVar20 = vaddps_avx512vl(auVar20,auVar18);
    auVar18 = vbroadcastss_avx512vl(auVar15);
    auVar15 = vaddps_avx512vl(auVar18,auVar20);
    auVar20 = vmulps_avx512vl(auVar212,auVar160);
    auVar20 = vshufps_avx512vl(auVar20,auVar20,0xe1);
    auVar213._0_4_ = viewMat._16_4_ * fVar184;
    auVar213._4_4_ = viewMat._20_4_ * fVar195;
    auVar213._8_4_ = fVar196 * 0.0;
    auVar213._12_4_ = fVar197 * 0.0;
    auVar16 = vaddps_avx512vl(auVar20,auVar213);
    auVar21 = vmulps_avx512vl(auVar21,auVar217);
    auVar20 = vinsertps_avx512f(auVar18,ZEXT416(_DAT_006006c0),0x10);
    auVar214._0_4_ = auVar20._0_4_ + auVar21._0_4_ + auVar16._0_4_;
    auVar214._4_4_ = auVar20._4_4_ + auVar21._4_4_ + auVar16._4_4_;
    auVar214._8_4_ = auVar20._8_4_ + auVar21._8_4_ + auVar16._8_4_;
    auVar214._12_4_ = auVar20._12_4_ + auVar21._12_4_ + auVar16._12_4_;
    fVar41 = viewMat._32_4_;
    fVar38 = viewMat._36_4_;
    auVar223._0_4_ = fVar184 * fVar41;
    auVar223._4_4_ = fVar195 * fVar38;
    auVar223._8_4_ = fVar196 * 0.0;
    auVar223._12_4_ = fVar197 * 0.0;
    auVar18 = vbroadcastss_avx512vl(ZEXT416((uint)DAT_006006cc));
    auVar20 = vshufps_avx(auVar223,auVar223,0xe1);
    auVar21 = vmulps_avx512vl(auVar123,auVar18);
    auVar218._0_4_ = auVar160._0_4_ * fVar41 + auVar20._0_4_ + auVar21._0_4_;
    auVar218._4_4_ = auVar160._4_4_ * fVar38 + auVar20._4_4_ + auVar21._4_4_;
    auVar218._8_4_ = auVar160._8_4_ * 0.0 + auVar20._8_4_ + auVar21._8_4_;
    auVar218._12_4_ = auVar160._12_4_ * 0.0 + auVar20._12_4_ + auVar21._12_4_;
    auVar20 = vmulps_avx512vl(auVar14,auVar18);
    auVar14 = vmulps_avx512vl(auVar25,auVar202);
    auVar14 = vshufps_avx512vl(auVar14,auVar14,0xe1);
    auVar203._0_4_ = fVar41 * auVar26._0_4_;
    auVar203._4_4_ = fVar38 * auVar26._4_4_;
    auVar203._8_4_ = auVar26._8_4_ * 0.0;
    auVar203._12_4_ = auVar26._12_4_ * 0.0;
    auVar14 = vaddps_avx512vl(auVar14,auVar203);
    auVar18 = vbroadcastss_avx512vl(auVar19);
    auVar204._0_4_ = auVar14._0_4_ + auVar20._0_4_ + auVar18._0_4_;
    auVar204._4_4_ = auVar14._4_4_ + auVar20._4_4_ + auVar18._4_4_;
    auVar204._8_4_ = auVar14._8_4_ + auVar20._8_4_ + auVar18._8_4_;
    auVar204._12_4_ = auVar14._12_4_ + auVar20._12_4_ + auVar18._12_4_;
    auVar14 = vshufps_avx(auVar218,auVar218,0xe1);
    auVar20 = vinsertps_avx(auVar18,ZEXT416(DAT_006006cc._4_4_),0x1c);
    auVar151._0_4_ = auVar14._0_4_ + auVar20._0_4_;
    auVar151._4_4_ = auVar14._4_4_ + auVar20._4_4_;
    auVar151._8_4_ = auVar14._8_4_ + auVar20._8_4_;
    auVar151._12_4_ = auVar14._12_4_ + auVar20._12_4_;
    fVar41 = viewMat._48_4_;
    auVar194._0_4_ = fVar184 * fVar41;
    fVar38 = viewMat._52_4_;
    auVar194._4_4_ = fVar195 * fVar38;
    auVar194._8_4_ = fVar196 * 0.0;
    auVar194._12_4_ = fVar197 * 0.0;
    auVar161._0_4_ = auVar160._0_4_ * fVar41;
    auVar161._4_4_ = auVar160._4_4_ * fVar38;
    auVar161._8_4_ = auVar160._8_4_ * 0.0;
    auVar161._12_4_ = auVar160._12_4_ * 0.0;
    auVar27._0_4_ = auVar26._0_4_ * fVar41;
    auVar27._4_4_ = auVar26._4_4_ * fVar38;
    auVar27._8_4_ = auVar26._8_4_ * 0.0;
    auVar27._12_4_ = auVar26._12_4_ * 0.0;
    auVar18 = vshufps_avx(auVar27,auVar27,0xe1);
    auVar20 = vmovshdup_avx(auVar161);
    auVar14 = vmovshdup_avx(auVar194);
    auVar21._0_4_ = auVar25._0_4_ * fVar41 + auVar18._0_4_ + (float)DAT_006006dc * auVar23._0_4_;
    auVar21._4_4_ = auVar25._4_4_ * fVar38 + auVar18._4_4_ + (float)DAT_006006dc * auVar23._4_4_;
    auVar21._8_4_ = auVar25._8_4_ * 0.0 + auVar18._8_4_ + (float)DAT_006006dc * auVar23._8_4_;
    auVar21._12_4_ = auVar25._12_4_ * 0.0 + auVar18._12_4_ + (float)DAT_006006dc * auVar23._12_4_;
    auVar18 = vmovshdup_avx(auVar123);
    auVar17 = vmulss_avx512f(ZEXT416((uint)DAT_006006dc._4_4_),auVar17);
    fVar41 = auVar17._0_4_;
    auVar20 = vinsertps_avx(ZEXT416((uint)(auVar194._0_4_ + auVar20._0_4_ +
                                           (float)DAT_006006dc * auVar18._0_4_ + fVar41)),
                            ZEXT416((uint)(DAT_006006dc._4_4_ +
                                          auVar161._0_4_ + auVar14._0_4_ +
                                          (float)DAT_006006dc * auVar123._0_4_)),0x10);
    auVar14 = vshufps_avx(auVar21,auVar21,0xe1);
    auVar17._0_4_ = auVar14._0_4_ + fVar41;
    auVar17._4_4_ = auVar14._4_4_ + fVar41;
    auVar17._8_4_ = auVar14._8_4_ + fVar41;
    auVar17._12_4_ = auVar14._12_4_ + fVar41;
    _viewMat = vmovlps_avx(auVar143);
    DAT_006006ac = vmovlps_avx(auVar180);
    DAT_006006b4 = vmovlps_avx(auVar15);
    _DAT_006006bc = vmovlps_avx(auVar214);
    DAT_006006c4 = vmovlps_avx(auVar204);
    DAT_006006cc = vmovlps_avx(auVar151);
    DAT_006006d4 = vmovlps_avx(auVar17);
    DAT_006006dc = vmovlps_avx(auVar20);
    local_238._0_4_ = local_188._0_4_ ^ 0x80000000;
    fVar183 = cosf(-(float)local_188._0_4_);
    auVar69._0_4_ = sinf((float)local_238._0_4_);
    auVar69._4_60_ = extraout_var_01;
    fVar182 = 1.0 - fVar183;
    auVar21 = ZEXT816(0) << 0x40;
    fVar38 = fVar182 * 0.0;
    auVar20 = vfmadd213ss_fma(ZEXT816(0) << 0x40,ZEXT416((uint)fVar182),
                              ZEXT416((uint)(auVar69._0_4_ * 0.0)));
    auVar14 = vfmadd213ss_fma(ZEXT416((uint)fVar182),auVar21,ZEXT416((uint)(auVar69._0_4_ * -0.0)));
    fVar41 = fVar38 + auVar69._0_4_ * -0.0;
    auVar15 = ZEXT416((uint)fVar38);
    auVar17 = vfmadd231ss_fma(ZEXT416((uint)fVar183),auVar15,auVar21);
    auVar18 = vfmadd213ss_fma(ZEXT816(0) << 0x40,auVar15,auVar69._0_16_);
    fVar38 = fVar38 + auVar69._0_4_ * 0.0;
    auVar15 = vfmsub213ss_fma(auVar15,auVar21,auVar69._0_16_);
    fVar195 = (fVar183 + fVar182) * 0.0;
    fVar181 = auVar20._0_4_ * 0.0;
    fVar184 = fVar195 + fVar181;
    fVar196 = auVar14._0_4_ * 0.0;
    fVar181 = fVar196 + fVar183 + fVar182 + fVar181;
    fVar195 = fVar196 + fVar195 + auVar20._0_4_;
    fVar182 = auVar14._0_4_ + fVar184;
    fVar196 = fVar196 + fVar184;
    fVar183 = fVar41 * 0.0;
    fVar110 = auVar17._0_4_;
    fVar111 = fVar110 * 0.0;
    fVar184 = fVar111 + fVar183;
    fVar97 = auVar18._0_4_ * 0.0;
    fVar41 = fVar97 + fVar111 + fVar41;
    fVar183 = fVar97 + fVar110 + fVar183;
    fVar197 = auVar18._0_4_ + fVar184;
    fVar97 = fVar97 + fVar184;
    fVar109 = fVar38 * 0.0;
    fVar162 = auVar15._0_4_ * 0.0;
    auVar17 = vxorps_avx512vl(auVar22,auVar22);
    fVar184 = fVar162 + fVar109;
    fVar38 = fVar111 + fVar38 + fVar162;
    fVar109 = fVar111 + auVar15._0_4_ + fVar109;
    fVar110 = fVar110 + fVar184;
    fVar111 = fVar111 + fVar184;
    auVar20 = vmulss_avx512f(ZEXT416((uint)viewMat),ZEXT416((uint)fVar181));
    auVar14 = vmulss_avx512f(ZEXT416((uint)viewMat),ZEXT416((uint)fVar195));
    auVar18 = vmulss_avx512f(ZEXT416((uint)viewMat),ZEXT416((uint)fVar182));
    auVar22 = vmulss_avx512f(ZEXT416((uint)viewMat_4),ZEXT416((uint)fVar41));
    auVar20 = vaddss_avx512f(auVar20,auVar22);
    auVar22 = vmulss_avx512f(ZEXT416((uint)viewMat_4),ZEXT416((uint)fVar183));
    auVar14 = vaddss_avx512f(auVar14,auVar22);
    auVar22 = vmulss_avx512f(ZEXT416((uint)viewMat_4),ZEXT416((uint)fVar197));
    auVar18 = vaddss_avx512f(auVar18,auVar22);
    auVar20 = vaddss_avx512f(ZEXT416((uint)((float)DAT_006006ac * fVar38)),auVar20);
    auVar22 = vmulss_avx512f(ZEXT416((uint)(float)DAT_006006ac),ZEXT416((uint)fVar109));
    auVar14 = vaddss_avx512f(auVar22,auVar14);
    auVar22 = vmulss_avx512f(ZEXT416((uint)(float)DAT_006006ac),ZEXT416((uint)fVar110));
    auVar18 = vaddss_avx512f(auVar22,auVar18);
    auVar22 = vmulss_avx512f(ZEXT416((uint)DAT_006006ac._4_4_),auVar17);
    auVar20 = vaddss_avx512f(auVar22,auVar20);
    auVar14 = vaddss_avx512f(auVar22,auVar14);
    auVar20 = vinsertps_avx(auVar20,auVar14,0x10);
    auVar14 = vaddss_avx512f(auVar22,auVar18);
    auVar14 = vinsertps_avx(auVar14,ZEXT416((uint)(DAT_006006ac._4_4_ +
                                                  (float)DAT_006006ac * fVar111 +
                                                  viewMat * fVar196 + viewMat_4 * fVar97)),0x10);
    auVar18 = vmulss_avx512f(ZEXT416((uint)fVar181),ZEXT416((uint)DAT_006006b4));
    auVar22 = vmulss_avx512f(ZEXT416((uint)fVar195),ZEXT416((uint)DAT_006006b4));
    auVar15 = vmulss_avx512f(ZEXT416((uint)fVar182),ZEXT416((uint)DAT_006006b4));
    auVar21 = vmulss_avx512f(ZEXT416((uint)fVar41),ZEXT416(DAT_006006b4._4_4_));
    auVar18 = vaddss_avx512f(auVar18,auVar21);
    auVar21 = vmulss_avx512f(ZEXT416((uint)fVar183),ZEXT416(DAT_006006b4._4_4_));
    auVar22 = vaddss_avx512f(auVar22,auVar21);
    auVar21 = vmulss_avx512f(ZEXT416((uint)fVar197),ZEXT416(DAT_006006b4._4_4_));
    auVar15 = vaddss_avx512f(auVar15,auVar21);
    auVar24 = ZEXT416((uint)fVar196);
    auVar21 = vmulss_avx512f(auVar24,ZEXT416((uint)DAT_006006b4));
    auVar28 = ZEXT416((uint)fVar97);
    auVar16 = vmulss_avx512f(auVar28,ZEXT416(DAT_006006b4._4_4_));
    auVar21 = vaddss_avx512f(auVar21,auVar16);
    auVar16 = vmulss_avx512f(ZEXT416((uint)fVar38),ZEXT416((uint)DAT_006006bc));
    auVar18 = vaddss_avx512f(auVar18,auVar16);
    auVar16 = vmulss_avx512f(ZEXT416((uint)fVar109),ZEXT416((uint)DAT_006006bc));
    auVar22 = vaddss_avx512f(auVar22,auVar16);
    auVar16 = vmulss_avx512f(ZEXT416((uint)fVar110),ZEXT416((uint)DAT_006006bc));
    auVar15 = vaddss_avx512f(auVar15,auVar16);
    auVar16 = vmulss_avx512f(ZEXT416((uint)fVar111),ZEXT416((uint)DAT_006006bc));
    auVar21 = vaddss_avx512f(auVar21,auVar16);
    auVar16 = vmulss_avx512f(ZEXT416(_DAT_006006c0),auVar17);
    auVar18 = vaddss_avx512f(auVar18,auVar16);
    auVar22 = vaddss_avx512f(auVar22,auVar16);
    auVar18 = vinsertps_avx(auVar18,auVar22,0x10);
    auVar22 = vaddss_avx512f(auVar15,auVar16);
    auVar15 = vaddss_avx512f(ZEXT416(_DAT_006006c0),auVar21);
    auVar15 = vinsertps_avx512f(auVar22,auVar15,0x10);
    auVar22 = vmulss_avx512f(ZEXT416((uint)fVar181),ZEXT416((uint)DAT_006006c4));
    auVar21 = vmulss_avx512f(ZEXT416((uint)fVar195),ZEXT416((uint)DAT_006006c4));
    auVar16 = vmulss_avx512f(ZEXT416((uint)fVar182),ZEXT416((uint)DAT_006006c4));
    auVar19 = vmulss_avx512f(ZEXT416((uint)fVar41),ZEXT416(DAT_006006c4._4_4_));
    auVar22 = vaddss_avx512f(auVar22,auVar19);
    auVar19 = vmulss_avx512f(ZEXT416((uint)fVar183),ZEXT416(DAT_006006c4._4_4_));
    auVar21 = vaddss_avx512f(auVar21,auVar19);
    auVar19 = vmulss_avx512f(ZEXT416((uint)fVar197),ZEXT416(DAT_006006c4._4_4_));
    auVar16 = vaddss_avx512f(auVar16,auVar19);
    auVar19 = vmulss_avx512f(auVar24,ZEXT416((uint)DAT_006006c4));
    auVar23 = vmulss_avx512f(auVar28,ZEXT416(DAT_006006c4._4_4_));
    auVar19 = vaddss_avx512f(auVar19,auVar23);
    auVar23 = vmulss_avx512f(ZEXT416((uint)fVar38),ZEXT416((uint)DAT_006006cc));
    auVar22 = vaddss_avx512f(auVar22,auVar23);
    auVar23 = vmulss_avx512f(ZEXT416((uint)fVar109),ZEXT416((uint)DAT_006006cc));
    auVar21 = vaddss_avx512f(auVar21,auVar23);
    auVar23 = vmulss_avx512f(ZEXT416((uint)fVar110),ZEXT416((uint)DAT_006006cc));
    auVar16 = vaddss_avx512f(auVar16,auVar23);
    auVar23 = vmulss_avx512f(ZEXT416((uint)fVar111),ZEXT416((uint)DAT_006006cc));
    auVar19 = vaddss_avx512f(auVar19,auVar23);
    auVar23 = vmulss_avx512f(ZEXT416(DAT_006006cc._4_4_),auVar17);
    auVar22 = vaddss_avx512f(auVar22,auVar23);
    auVar21 = vaddss_avx512f(auVar21,auVar23);
    auVar21 = vinsertps_avx512f(auVar22,auVar21,0x10);
    auVar22 = vaddss_avx512f(auVar16,auVar23);
    auVar16 = vaddss_avx512f(ZEXT416(DAT_006006cc._4_4_),auVar19);
    auVar16 = vinsertps_avx512f(auVar22,auVar16,0x10);
    auVar22 = vmulss_avx512f(ZEXT416((uint)fVar181),ZEXT416((uint)DAT_006006d4));
    auVar19 = vmulss_avx512f(ZEXT416((uint)fVar195),ZEXT416((uint)DAT_006006d4));
    auVar23 = vmulss_avx512f(ZEXT416((uint)fVar182),ZEXT416((uint)DAT_006006d4));
    auVar24 = vmulss_avx512f(auVar24,ZEXT416((uint)DAT_006006d4));
    auVar25 = vmulss_avx512f(ZEXT416((uint)fVar41),ZEXT416(DAT_006006d4._4_4_));
    auVar26 = vmulss_avx512f(ZEXT416((uint)fVar183),ZEXT416(DAT_006006d4._4_4_));
    auVar27 = vmulss_avx512f(ZEXT416((uint)fVar197),ZEXT416(DAT_006006d4._4_4_));
    auVar28 = vmulss_avx512f(auVar28,ZEXT416(DAT_006006d4._4_4_));
    auVar17 = vmulss_avx512f(ZEXT416((uint)DAT_006006dc._4_4_),auVar17);
    fVar41 = auVar17._0_4_;
    auVar17 = vinsertps_avx(ZEXT416((uint)(auVar25._0_4_ + auVar22._0_4_ +
                                           fVar38 * (float)DAT_006006dc + fVar41)),
                            ZEXT416((uint)(auVar26._0_4_ + auVar19._0_4_ +
                                           fVar109 * (float)DAT_006006dc + fVar41)),0x10);
    auVar22 = vinsertps_avx(ZEXT416((uint)(auVar23._0_4_ + auVar27._0_4_ +
                                           fVar110 * (float)DAT_006006dc + fVar41)),
                            ZEXT416((uint)(DAT_006006dc._4_4_ +
                                          auVar24._0_4_ + auVar28._0_4_ +
                                          fVar111 * (float)DAT_006006dc)),0x10);
    _viewMat = vmovlps_avx(auVar20);
    DAT_006006ac = vmovlps_avx(auVar14);
    DAT_006006b4 = vmovlps_avx(auVar18);
    _DAT_006006bc = vmovlps_avx(auVar15);
    DAT_006006c4 = vmovlps_avx512f(auVar21);
    DAT_006006cc = vmovlps_avx512f(auVar16);
    DAT_006006d4 = vmovlps_avx(auVar17);
    DAT_006006dc = vmovlps_avx(auVar22);
  }
  requestRedraw();
  midflight = 0;
  return;
}

Assistant:

void processRotate(glm::vec2 startP, glm::vec2 endP) {

  if (startP == endP) {
    return;
  }

  // Get frame
  glm::vec3 frameLookDir, frameUpDir, frameRightDir;
  getCameraFrame(frameLookDir, frameUpDir, frameRightDir);

  switch (getNavigateStyle()) {
  case NavigateStyle::Turntable: {

    glm::vec2 dragDelta = endP - startP;
    float delTheta = 2.0 * dragDelta.x * moveScale;
    float delPhi = 2.0 * dragDelta.y * moveScale;

    // Translate to center
    viewMat = glm::translate(viewMat, state::center());

    // Rotation about the horizontal axis
    glm::mat4x4 phiCamR = glm::rotate(glm::mat4x4(1.0), -delPhi, frameRightDir);
    viewMat = viewMat * phiCamR;

    // Rotation about the vertical axis
    glm::vec3 turntableUp;
    glm::mat4x4 thetaCamR = glm::rotate(glm::mat4x4(1.0), delTheta, getUpVec());
    viewMat = viewMat * thetaCamR;

    // Undo centering
    viewMat = glm::translate(viewMat, -state::center());
    break;
  }
  case NavigateStyle::Free: {
    glm::vec2 dragDelta = endP - startP;
    float delTheta = 2.0 * dragDelta.x * moveScale;
    float delPhi = 2.0 * dragDelta.y * moveScale;

    // Translate to center
    viewMat = glm::translate(viewMat, state::center());

    // Rotation about the vertical axis
    glm::mat4x4 thetaCamR = glm::rotate(glm::mat4x4(1.0), delTheta, frameUpDir);
    viewMat = viewMat * thetaCamR;

    // Rotation about the horizontal axis
    glm::mat4x4 phiCamR = glm::rotate(glm::mat4x4(1.0), -delPhi, frameRightDir);
    viewMat = viewMat * phiCamR;

    // Undo centering
    viewMat = glm::translate(viewMat, -state::center());
    break;
  }
  case NavigateStyle::Planar: {
    // Do nothing
    break;
  }
  case NavigateStyle::Arcball: {
    // Map inputs to unit sphere
    auto toSphere = [](glm::vec2 v) {
      double x = glm::clamp(v.x, -1.0f, 1.0f);
      double y = glm::clamp(v.y, -1.0f, 1.0f);
      double mag = x * x + y * y;
      if (mag <= 1.0) {
        return glm::vec3{x, y, -std::sqrt(1.0 - mag)};
      } else {
        return glm::normalize(glm::vec3{x, y, 0.0});
      }
    };
    glm::vec3 sphereStart = toSphere(startP);
    glm::vec3 sphereEnd = toSphere(endP);

    glm::vec3 rotAxis = -cross(sphereStart, sphereEnd);
    double rotMag = std::acos(glm::clamp(dot(sphereStart, sphereEnd), -1.0f, 1.0f) * moveScale);

    glm::mat4 cameraRotate = glm::rotate(glm::mat4x4(1.0), (float)rotMag, glm::vec3(rotAxis.x, rotAxis.y, rotAxis.z));

    // Get current camera rotation
    glm::mat4x4 R;
    for (int i = 0; i < 3; i++) {
      for (int j = 0; j < 3; j++) {
        R[i][j] = viewMat[i][j];
      }
    }
    R[3][3] = 1.0;

    glm::mat4 update = glm::inverse(R) * cameraRotate * R;

    viewMat = viewMat * update;
    break;
  }
  case NavigateStyle::None: {
    // Do nothing
    break;
  }
  case NavigateStyle::FirstPerson: {
    glm::vec2 dragDelta = endP - startP;
    float delTheta = 2.0 * dragDelta.x * moveScale;
    float delPhi = 2.0 * dragDelta.y * moveScale;

    // Rotation about the vertical axis
    glm::vec3 rotAx = glm::mat3(viewMat) * getUpVec();
    glm::mat4x4 thetaCamR = glm::rotate(glm::mat4x4(1.0), delTheta, rotAx);
    viewMat = thetaCamR * viewMat;

    // Rotation about the horizontal axis
    glm::mat4x4 phiCamR = glm::rotate(glm::mat4x4(1.0), -delPhi, glm::vec3(1.f, 0.f, 0.f));
    viewMat = phiCamR * viewMat;

    break;
  }
  }

  requestRedraw();
  immediatelyEndFlight();
}